

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

void * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                      int bpc)

{
  anon_struct_96_18_0d0905d3 *paVar1;
  short sVar2;
  undefined8 uVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  byte bVar26;
  short sVar27;
  uint uVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  stbi_uc sVar32;
  byte bVar33;
  int iVar34;
  stbi__uint32 sVar35;
  uint uVar36;
  int iVar37;
  uint extraout_EAX;
  int iVar38;
  uint uVar39;
  uint uVar40;
  stbi__jpeg *psVar41;
  byte *pbVar42;
  uchar *puVar43;
  float *data_00;
  stbi_uc *psVar44;
  void *pvVar45;
  code *pcVar46;
  stbi__uint16 *psVar47;
  stbi__gif *g;
  stbi_uc *psVar48;
  stbi_uc *psVar49;
  stbi__context *psVar50;
  byte bVar51;
  uint uVar52;
  uint uVar53;
  stbi_uc *psVar54;
  long lVar55;
  long lVar56;
  uchar uVar57;
  byte bVar58;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint extraout_EDX_01;
  uint extraout_EDX_02;
  uint extraout_EDX_03;
  uint extraout_EDX_04;
  uint extraout_EDX_05;
  uint extraout_EDX_06;
  int why;
  uint uVar59;
  uint uVar60;
  anon_struct_96_18_0d0905d3 *extraout_RDX;
  anon_struct_96_18_0d0905d3 *extraout_RDX_00;
  anon_struct_96_18_0d0905d3 *paVar61;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  int iVar62;
  ulong uVar63;
  uchar *puVar64;
  byte *pbVar65;
  int iVar66;
  ulong uVar67;
  int *piVar68;
  stbi__uint32 sVar69;
  uint uVar70;
  stbi__uint16 *__ptr;
  stbi__result_info *ri_00;
  int iVar71;
  uint uVar72;
  ulong uVar73;
  int *piVar74;
  char *pcVar75;
  uint uVar76;
  short *psVar77;
  ulong uVar78;
  int iVar79;
  stbi_uc (*pal) [4];
  bool bVar80;
  undefined1 auVar81 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  stbi_uc *coutput [4];
  short data [64];
  int local_54c;
  undefined8 local_528;
  uint local_518;
  int local_4f8;
  uint local_4f0;
  uint local_4a4;
  int local_4a0;
  stbi__bmp_data local_498;
  undefined4 local_474;
  int local_470;
  uint local_46c;
  anon_struct_96_18_0d0905d3 *local_468;
  long local_460;
  stbi__uint32 local_454;
  int local_450;
  uint local_44c;
  int local_448;
  uint local_444;
  uint local_440;
  uint local_43c;
  stbi__png local_438;
  int local_410 [248];
  
  ri->bits_per_channel = 8;
  ri->num_channels = 0;
  ri->channel_order = 0;
  ri_00 = ri;
  psVar41 = (stbi__jpeg *)malloc(0x4888);
  psVar41->s = s;
  psVar41->idct_block_kernel = stbi__idct_simd;
  psVar41->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
  psVar41->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
  psVar41->jfif = 0;
  psVar41->app14_color_transform = -1;
  psVar41->marker = 0xff;
  sVar32 = stbi__get_marker(psVar41);
  if (sVar32 != 0xd8) {
    stbi__g_failure_reason = "no SOI";
  }
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  free(psVar41);
  if (sVar32 == 0xd8) {
    psVar41 = (stbi__jpeg *)malloc(0x4888);
    psVar41->s = s;
    psVar41->idct_block_kernel = stbi__idct_simd;
    psVar41->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
    psVar41->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
    s->img_n = 0;
    if ((uint)req_comp < 5) {
      psVar41->img_comp[0].raw_data = (void *)0x0;
      psVar41->img_comp[0].raw_coeff = (void *)0x0;
      psVar41->img_comp[1].raw_data = (void *)0x0;
      psVar41->img_comp[1].raw_coeff = (void *)0x0;
      psVar41->img_comp[2].raw_data = (void *)0x0;
      psVar41->img_comp[2].raw_coeff = (void *)0x0;
      psVar41->img_comp[3].raw_data = (void *)0x0;
      psVar41->img_comp[3].raw_coeff = (void *)0x0;
      psVar41->restart_interval = 0;
      iVar34 = stbi__decode_jpeg_header(psVar41,0);
      uVar72 = extraout_EDX;
      if (iVar34 != 0) {
        paVar1 = psVar41->img_comp;
        bVar33 = stbi__get_marker(psVar41);
LAB_0010ea51:
        if (bVar33 == 0xda) {
          iVar34 = stbi__get16be(psVar41->s);
          psVar50 = psVar41->s;
          pbVar65 = psVar50->img_buffer;
          paVar61 = extraout_RDX;
          if (pbVar65 < psVar50->img_buffer_end) {
            psVar50->img_buffer = pbVar65 + 1;
            bVar33 = *pbVar65;
LAB_0010eb4a:
            uVar72 = (uint)bVar33;
            psVar41->scan_n = uVar72;
            if (((byte)(bVar33 - 5) < 0xfc) || (psVar50 = psVar41->s, psVar50->img_n < (int)uVar72))
            goto LAB_00110645;
            if (iVar34 != uVar72 * 2 + 6) {
              stbi__g_failure_reason = "bad SOS len";
              goto LAB_0011064c;
            }
            lVar56 = 0;
            do {
              pbVar42 = psVar50->img_buffer;
              pbVar65 = psVar50->img_buffer_end;
              if (pbVar42 < pbVar65) {
                psVar50->img_buffer = pbVar42 + 1;
                uVar76 = (uint)*pbVar42;
                pbVar42 = pbVar42 + 1;
              }
              else if (psVar50->read_from_callbacks == 0) {
                uVar76 = 0;
              }
              else {
                psVar44 = psVar50->buffer_start;
                iVar34 = (*(psVar50->io).read)
                                   (psVar50->io_user_data,(char *)psVar44,psVar50->buflen);
                if (iVar34 == 0) {
                  psVar50->read_from_callbacks = 0;
                  psVar54 = psVar50->buffer_start + 1;
                  psVar50->buffer_start[0] = '\0';
                  uVar76 = 0;
                }
                else {
                  psVar54 = psVar44 + iVar34;
                  uVar76 = (uint)*psVar44;
                }
                psVar50->img_buffer_end = psVar54;
                psVar50->img_buffer = psVar50->buffer_start + 1;
                psVar50 = psVar41->s;
                pbVar42 = psVar50->img_buffer;
                pbVar65 = psVar50->img_buffer_end;
              }
              if (pbVar42 < pbVar65) {
                psVar50->img_buffer = pbVar42 + 1;
                uVar36 = (uint)*pbVar42;
              }
              else if (psVar50->read_from_callbacks == 0) {
                uVar36 = 0;
              }
              else {
                psVar44 = psVar50->buffer_start;
                iVar34 = (*(psVar50->io).read)
                                   (psVar50->io_user_data,(char *)psVar44,psVar50->buflen);
                if (iVar34 == 0) {
                  psVar50->read_from_callbacks = 0;
                  psVar54 = psVar50->buffer_start + 1;
                  psVar50->buffer_start[0] = '\0';
                  uVar36 = 0;
                }
                else {
                  psVar54 = psVar44 + iVar34;
                  uVar36 = (uint)*psVar44;
                }
                psVar50->img_buffer_end = psVar54;
                psVar50->img_buffer = psVar50->buffer_start + 1;
                psVar50 = psVar41->s;
              }
              uVar72 = psVar50->img_n;
              if ((long)(int)uVar72 < 1) {
                uVar63 = 0;
              }
              else {
                uVar63 = 0;
                paVar61 = paVar1;
                while (paVar61->id != uVar76) {
                  uVar63 = uVar63 + 1;
                  paVar61 = paVar61 + 1;
                  if ((long)(int)uVar72 == uVar63) goto LAB_00110653;
                }
              }
              if ((uint)uVar63 == uVar72) goto LAB_00110653;
              uVar78 = uVar63 & 0xffffffff;
              paVar61 = (anon_struct_96_18_0d0905d3 *)(uVar78 * 0x60);
              psVar41->img_comp[uVar78].hd = uVar36 >> 4;
              if (0x3f < (byte)uVar36) {
                stbi__g_failure_reason = "bad DC huff";
                goto LAB_0011064c;
              }
              paVar61 = paVar1 + uVar78;
              paVar61->ha = uVar36 & 0xf;
              if (3 < (uVar36 & 0xf)) {
                stbi__g_failure_reason = "bad AC huff";
                goto LAB_0011064c;
              }
              psVar41->order[lVar56] = (uint)uVar63;
              lVar56 = lVar56 + 1;
            } while (lVar56 < psVar41->scan_n);
            pbVar65 = psVar50->img_buffer;
            pbVar42 = psVar50->img_buffer_end;
            if (pbVar65 < pbVar42) {
              psVar50->img_buffer = pbVar65 + 1;
              bVar33 = *pbVar65;
              pbVar65 = pbVar65 + 1;
            }
            else if (psVar50->read_from_callbacks == 0) {
              bVar33 = 0;
            }
            else {
              psVar44 = psVar50->buffer_start;
              iVar34 = (*(psVar50->io).read)(psVar50->io_user_data,(char *)psVar44,psVar50->buflen);
              if (iVar34 == 0) {
                psVar50->read_from_callbacks = 0;
                psVar54 = psVar50->buffer_start + 1;
                psVar50->buffer_start[0] = '\0';
                bVar33 = 0;
              }
              else {
                psVar54 = psVar44 + iVar34;
                bVar33 = *psVar44;
              }
              psVar50->img_buffer_end = psVar54;
              psVar50->img_buffer = psVar50->buffer_start + 1;
              psVar50 = psVar41->s;
              pbVar65 = psVar50->img_buffer;
              pbVar42 = psVar50->img_buffer_end;
            }
            psVar41->spec_start = (uint)bVar33;
            if (pbVar65 < pbVar42) {
              psVar50->img_buffer = pbVar65 + 1;
              uVar72 = (uint)*pbVar65;
              pbVar65 = pbVar65 + 1;
            }
            else if (psVar50->read_from_callbacks == 0) {
              uVar72 = 0;
            }
            else {
              psVar44 = psVar50->buffer_start;
              iVar34 = (*(psVar50->io).read)(psVar50->io_user_data,(char *)psVar44,psVar50->buflen);
              if (iVar34 == 0) {
                psVar50->read_from_callbacks = 0;
                psVar54 = psVar50->buffer_start + 1;
                psVar50->buffer_start[0] = '\0';
                uVar72 = 0;
              }
              else {
                psVar54 = psVar44 + iVar34;
                uVar72 = (uint)*psVar44;
              }
              psVar50->img_buffer_end = psVar54;
              psVar50->img_buffer = psVar50->buffer_start + 1;
              psVar50 = psVar41->s;
              pbVar65 = psVar50->img_buffer;
              pbVar42 = psVar50->img_buffer_end;
            }
            psVar41->spec_end = uVar72;
            if (pbVar65 < pbVar42) {
              psVar50->img_buffer = pbVar65 + 1;
              uVar72 = (uint)*pbVar65;
            }
            else if (psVar50->read_from_callbacks == 0) {
              uVar72 = 0;
            }
            else {
              psVar44 = psVar50->buffer_start;
              iVar34 = (*(psVar50->io).read)(psVar50->io_user_data,(char *)psVar44,psVar50->buflen);
              if (iVar34 == 0) {
                psVar50->read_from_callbacks = 0;
                psVar54 = psVar50->buffer_start + 1;
                psVar50->buffer_start[0] = '\0';
                uVar72 = 0;
              }
              else {
                psVar54 = psVar44 + iVar34;
                uVar72 = (uint)*psVar44;
              }
              psVar50->img_buffer_end = psVar54;
              psVar50->img_buffer = psVar50->buffer_start + 1;
            }
            psVar41->succ_high = uVar72 >> 4;
            uVar76 = uVar72 & 0xf;
            paVar61 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar76;
            psVar41->succ_low = uVar76;
            iVar34 = psVar41->progressive;
            iVar79 = psVar41->spec_start;
            if (iVar34 == 0) {
              if ((iVar79 != 0) || ((0xf < (byte)uVar72 || (uVar76 != 0)))) {
LAB_001119a6:
                stbi__g_failure_reason = "bad SOS";
                goto LAB_0011064c;
              }
              psVar41->spec_end = 0x3f;
            }
            else if ((((0x3f < iVar79) || (0x3f < psVar41->spec_end)) ||
                     (psVar41->spec_end < iVar79)) || ((0xdf < (byte)uVar72 || (0xd < uVar76))))
            goto LAB_001119a6;
            uVar72 = psVar41->scan_n;
            uVar63 = (ulong)uVar72;
            iVar79 = psVar41->restart_interval;
            if (iVar79 == 0) {
              iVar79 = 0x7fffffff;
            }
            psVar41->code_buffer = 0;
            psVar41->code_bits = 0;
            psVar41->nomore = 0;
            psVar41->img_comp[3].dc_pred = 0;
            psVar41->img_comp[2].dc_pred = 0;
            psVar41->img_comp[1].dc_pred = 0;
            psVar41->img_comp[0].dc_pred = 0;
            psVar41->marker = 0xff;
            psVar41->todo = iVar79;
            psVar41->eob_run = 0;
            if (iVar34 == 0) {
              if (uVar72 == 1) {
                iVar34 = psVar41->order[0];
                iVar79 = psVar41->img_comp[iVar34].y + 7 >> 3;
                bVar80 = true;
                uVar72 = 1;
                if (0 < iVar79) {
                  uVar76 = paVar1[iVar34].x + 7 >> 3;
                  iVar38 = 0;
                  iVar71 = 0;
                  do {
                    if (0 < (int)uVar76) {
                      lVar56 = 0;
                      do {
                        iVar62 = stbi__jpeg_decode_block
                                           (psVar41,(short *)&local_438,
                                            (stbi__huffman *)
                                            psVar41->huff_dc[paVar1[iVar34].hd].fast,
                                            (stbi__huffman *)
                                            psVar41->huff_ac[paVar1[iVar34].ha].fast,
                                            psVar41->fast_ac[paVar1[iVar34].ha],iVar34,
                                            psVar41->dequant[paVar1[iVar34].tq]);
                        uVar72 = extraout_EDX_02;
                        if (iVar62 == 0) goto LAB_0010fd62;
                        (*psVar41->idct_block_kernel)
                                  (paVar1[iVar34].data + lVar56 + iVar38 * paVar1[iVar34].w2,
                                   paVar1[iVar34].w2,(short *)&local_438);
                        uVar72 = (uint)extraout_RDX_01;
                        iVar62 = psVar41->todo;
                        psVar41->todo = iVar62 + -1;
                        uVar63 = extraout_RDX_01;
                        if (iVar62 < 2) {
                          if (psVar41->code_bits < 0x18) {
                            stbi__grow_buffer_unsafe(psVar41);
                            uVar72 = extraout_EDX_03;
                          }
                          if ((psVar41->marker & 0xf8) != 0xd0) goto LAB_0010f966;
                          psVar41->code_buffer = 0;
                          psVar41->code_bits = 0;
                          psVar41->nomore = 0;
                          psVar41->img_comp[3].dc_pred = 0;
                          psVar41->img_comp[2].dc_pred = 0;
                          psVar41->img_comp[1].dc_pred = 0;
                          psVar41->img_comp[0].dc_pred = 0;
                          psVar41->marker = 0xff;
                          iVar62 = psVar41->restart_interval;
                          uVar63 = 0x7fffffff;
                          if (iVar62 == 0) {
                            iVar62 = 0x7fffffff;
                          }
                          psVar41->todo = iVar62;
                          psVar41->eob_run = 0;
                        }
                        lVar56 = lVar56 + 8;
                      } while ((ulong)uVar76 * 8 != lVar56);
                    }
                    uVar72 = (uint)uVar63;
                    iVar71 = iVar71 + 1;
                    iVar38 = iVar38 + 8;
                  } while (iVar71 != iVar79);
LAB_0010f966:
                  bVar80 = true;
                }
              }
              else {
                uVar72 = psVar41->img_mcu_y;
                uVar63 = (ulong)uVar72;
                bVar80 = true;
                if (0 < (int)uVar72) {
                  iVar34 = psVar41->img_mcu_x;
                  iVar71 = 0;
                  do {
                    if (0 < iVar34) {
                      uVar76 = 0;
                      do {
                        iVar34 = psVar41->scan_n;
                        if (0 < iVar34) {
                          uVar63 = 0;
                          do {
                            iVar79 = psVar41->order[uVar63];
                            iVar38 = psVar41->img_comp[iVar79].v;
                            if (0 < iVar38) {
                              iVar34 = paVar1[iVar79].h;
                              iVar62 = 0;
                              do {
                                if (0 < iVar34) {
                                  iVar38 = 0;
                                  do {
                                    iVar66 = paVar1[iVar79].v;
                                    iVar37 = stbi__jpeg_decode_block
                                                       (psVar41,(short *)&local_438,
                                                        (stbi__huffman *)
                                                        psVar41->huff_dc[paVar1[iVar79].hd].fast,
                                                        (stbi__huffman *)
                                                        psVar41->huff_ac[paVar1[iVar79].ha].fast,
                                                        psVar41->fast_ac[paVar1[iVar79].ha],iVar79,
                                                        psVar41->dequant[paVar1[iVar79].tq]);
                                    uVar72 = extraout_EDX_05;
                                    if (iVar37 == 0) goto LAB_0010fd62;
                                    (*psVar41->idct_block_kernel)
                                              (paVar1[iVar79].data +
                                               (long)(int)((iVar34 * uVar76 + iVar38) * 8) +
                                               (long)((iVar66 * iVar71 + iVar62) * paVar1[iVar79].w2
                                                     * 8),paVar1[iVar79].w2,(short *)&local_438);
                                    iVar38 = iVar38 + 1;
                                    iVar34 = paVar1[iVar79].h;
                                  } while (iVar38 < iVar34);
                                  iVar38 = paVar1[iVar79].v;
                                }
                                iVar62 = iVar62 + 1;
                              } while (iVar62 < iVar38);
                              iVar34 = psVar41->scan_n;
                            }
                            uVar63 = uVar63 + 1;
                          } while ((long)uVar63 < (long)iVar34);
                          iVar79 = psVar41->todo;
                        }
                        uVar72 = (uint)uVar63;
                        bVar80 = true;
                        psVar41->todo = iVar79 + -1;
                        bVar4 = iVar79 < 2;
                        iVar79 = iVar79 + -1;
                        if (bVar4) {
                          if (psVar41->code_bits < 0x18) {
                            stbi__grow_buffer_unsafe(psVar41);
                            uVar72 = extraout_EDX_06;
                          }
                          if ((psVar41->marker & 0xf8) != 0xd0) goto LAB_0010fd64;
                          psVar41->code_buffer = 0;
                          psVar41->code_bits = 0;
                          psVar41->nomore = 0;
                          psVar41->img_comp[3].dc_pred = 0;
                          psVar41->img_comp[2].dc_pred = 0;
                          psVar41->img_comp[1].dc_pred = 0;
                          psVar41->img_comp[0].dc_pred = 0;
                          psVar41->marker = 0xff;
                          iVar79 = psVar41->restart_interval;
                          if (iVar79 == 0) {
                            iVar79 = 0x7fffffff;
                          }
                          psVar41->todo = iVar79;
                          psVar41->eob_run = 0;
                        }
                        uVar76 = uVar76 + 1;
                        uVar63 = (ulong)uVar76;
                        iVar34 = psVar41->img_mcu_x;
                      } while ((int)uVar76 < iVar34);
                      uVar63 = (ulong)(uint)psVar41->img_mcu_y;
                    }
                    bVar80 = true;
                    iVar71 = iVar71 + 1;
                    uVar72 = (uint)uVar63;
                  } while (iVar71 < (int)uVar72);
                }
              }
              goto LAB_0010fd64;
            }
            if (uVar72 == 1) {
              local_460 = (long)psVar41->order[0];
              local_470 = psVar41->img_comp[local_460].y + 7 >> 3;
              if (0 < local_470) {
                local_468 = paVar1 + local_460;
                iVar34 = psVar41->img_comp[local_460].x + 7 >> 3;
                local_4f8 = 0;
                do {
                  if (0 < iVar34) {
                    iVar79 = 0;
                    do {
                      psVar77 = local_468->coeff + (local_468->coeff_w * local_4f8 + iVar79) * 0x40;
                      uVar63 = (ulong)psVar41->spec_start;
                      if (uVar63 == 0) {
                        iVar71 = stbi__jpeg_decode_block_prog_dc
                                           (psVar41,psVar77,
                                            (stbi__huffman *)psVar41->huff_dc[local_468->hd].fast,
                                            (int)local_460);
                        uVar72 = extraout_EDX_01;
                        if (iVar71 == 0) goto LAB_00110653;
                      }
                      else {
                        iVar71 = local_468->ha;
                        iVar38 = psVar41->eob_run;
                        bVar33 = (byte)psVar41->succ_low;
                        if (psVar41->succ_high == 0) {
                          if (iVar38 == 0) {
                            paVar61 = (anon_struct_96_18_0d0905d3 *)(ulong)(uint)psVar41->code_bits;
                            do {
                              if ((int)paVar61 < 0x10) {
                                stbi__grow_buffer_unsafe(psVar41);
                              }
                              uVar72 = psVar41->code_buffer;
                              uVar78 = (ulong)(uVar72 >> 0x17);
                              sVar2 = psVar41->fast_ac[iVar71][uVar78];
                              uVar76 = (uint)sVar2;
                              iVar38 = (int)uVar63;
                              if (sVar2 == 0) {
                                if (psVar41->code_bits < 0x10) {
                                  stbi__grow_buffer_unsafe(psVar41);
                                  uVar72 = psVar41->code_buffer;
                                  uVar78 = (ulong)(uVar72 >> 0x17);
                                }
                                uVar63 = (ulong)psVar41->huff_ac[iVar71].fast[uVar78];
                                if (uVar63 == 0xff) {
                                  lVar56 = 0;
                                  do {
                                    lVar55 = lVar56;
                                    lVar56 = lVar55 + 1;
                                  } while (psVar41->huff_ac[iVar71].maxcode[lVar55 + 10] <=
                                           uVar72 >> 0x10);
                                  uVar76 = psVar41->code_bits;
                                  paVar61 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar76;
                                  if (lVar56 == 8) goto LAB_00112559;
                                  if ((int)uVar76 < (int)(lVar55 + 10)) goto LAB_00112562;
                                  uVar63 = (ulong)(int)((uVar72 >> (0x17U - (char)lVar56 & 0x1f) &
                                                        stbi__bmask[lVar55 + 10]) +
                                                       psVar41->huff_ac[iVar71].delta[lVar55 + 10]);
                                  bVar58 = psVar41->huff_ac[iVar71].size[uVar63];
                                  if ((uVar72 >> (-bVar58 & 0x1f) & stbi__bmask[bVar58]) !=
                                      (uint)psVar41->huff_ac[iVar71].code[uVar63])
                                  goto LAB_00113006;
                                  uVar76 = (uVar76 - (int)lVar56) - 9;
                                  paVar61 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar76;
                                  psVar41->code_bits = uVar76;
                                  sVar35 = uVar72 << ((byte)(lVar55 + 10) & 0x1f);
                                  psVar41->code_buffer = sVar35;
                                }
                                else {
                                  bVar58 = psVar41->huff_ac[iVar71].size[uVar63];
                                  uVar76 = psVar41->code_bits - (uint)bVar58;
                                  paVar61 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar76;
                                  if (psVar41->code_bits < (int)(uint)bVar58) goto LAB_00112562;
                                  sVar35 = uVar72 << (bVar58 & 0x1f);
                                  psVar41->code_buffer = sVar35;
                                  psVar41->code_bits = uVar76;
                                }
                                bVar58 = psVar41->huff_ac[iVar71].values[uVar63];
                                uVar72 = bVar58 & 0xf;
                                bVar26 = bVar58 >> 4;
                                uVar76 = (uint)bVar26;
                                iVar62 = (int)paVar61;
                                if ((bVar58 & 0xf) == 0) {
                                  if (bVar58 < 0xf0) {
                                    iVar38 = 1 << bVar26;
                                    psVar41->eob_run = iVar38;
                                    if (0xf < bVar58) {
                                      if (iVar62 < (int)uVar76) {
                                        stbi__grow_buffer_unsafe(psVar41);
                                        sVar35 = psVar41->code_buffer;
                                        iVar62 = psVar41->code_bits;
                                        iVar38 = psVar41->eob_run;
                                      }
                                      uVar36 = sVar35 << bVar26 | sVar35 >> 0x20 - bVar26;
                                      uVar72 = stbi__bmask[uVar76];
                                      psVar41->code_buffer = ~uVar72 & uVar36;
                                      iVar38 = iVar38 + (uVar36 & uVar72);
                                      psVar41->code_bits = iVar62 - uVar76;
                                    }
                                    goto LAB_0010f158;
                                  }
                                  uVar72 = iVar38 + 0x10;
                                }
                                else {
                                  lVar56 = (long)iVar38 + (ulong)uVar76;
                                  bVar58 = ""[lVar56];
                                  if (iVar62 < (int)uVar72) {
                                    stbi__grow_buffer_unsafe(psVar41);
                                    sVar35 = psVar41->code_buffer;
                                    iVar62 = psVar41->code_bits;
                                  }
                                  uVar36 = sVar35 << (sbyte)uVar72 | sVar35 >> 0x20 - (sbyte)uVar72;
                                  uVar76 = *(uint *)((long)stbi__bmask + (ulong)(uVar72 * 4));
                                  psVar41->code_buffer = ~uVar76 & uVar36;
                                  paVar61 = (anon_struct_96_18_0d0905d3 *)(ulong)(iVar62 - uVar72);
                                  psVar41->code_bits = iVar62 - uVar72;
                                  iVar38 = 0;
                                  if (-1 < (int)sVar35) {
                                    iVar38 = *(int *)((long)stbi__jbias + (ulong)(uVar72 * 4));
                                  }
                                  uVar72 = (int)lVar56 + 1;
                                  psVar77[bVar58] =
                                       (short)((uVar36 & uVar76) + iVar38 << (bVar33 & 0x1f));
                                }
                              }
                              else {
                                lVar56 = (long)iVar38 + (ulong)(uVar76 >> 4 & 0xf);
                                psVar41->code_buffer = uVar72 << (sbyte)(uVar76 & 0xf);
                                uVar72 = psVar41->code_bits - (uVar76 & 0xf);
                                paVar61 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar72;
                                psVar41->code_bits = uVar72;
                                uVar72 = (int)lVar56 + 1;
                                psVar77[""[lVar56]] = (short)((uVar76 >> 8) << (bVar33 & 0x1f));
                              }
                              uVar63 = (ulong)uVar72;
                            } while ((int)uVar72 <= psVar41->spec_end);
                          }
                          else {
LAB_0010f158:
                            psVar41->eob_run = iVar38 + -1;
                          }
                        }
                        else if (iVar38 == 0) {
                          iVar38 = 0x10000 << (bVar33 & 0x1f);
                          paVar61 = (anon_struct_96_18_0d0905d3 *)(ulong)(uint)psVar41->code_bits;
                          do {
                            if ((int)paVar61 < 0x10) {
                              stbi__grow_buffer_unsafe(psVar41);
                            }
                            uVar72 = psVar41->code_buffer;
                            uVar78 = (ulong)psVar41->huff_ac[iVar71].fast[uVar72 >> 0x17];
                            if (uVar78 == 0xff) {
                              lVar56 = 0;
                              do {
                                lVar55 = lVar56;
                                lVar56 = lVar55 + 1;
                              } while (psVar41->huff_ac[iVar71].maxcode[lVar55 + 10] <=
                                       uVar72 >> 0x10);
                              uVar76 = psVar41->code_bits;
                              paVar61 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar76;
                              if (lVar56 == 8) goto LAB_00112559;
                              if ((int)uVar76 < (int)(lVar55 + 10)) goto LAB_00112562;
                              uVar78 = (ulong)(int)((uVar72 >> (0x17U - (char)lVar56 & 0x1f) &
                                                    stbi__bmask[lVar55 + 10]) +
                                                   psVar41->huff_ac[iVar71].delta[lVar55 + 10]);
                              bVar58 = psVar41->huff_ac[iVar71].size[uVar78];
                              if ((uVar72 >> (-bVar58 & 0x1f) & stbi__bmask[bVar58]) !=
                                  (uint)psVar41->huff_ac[iVar71].code[uVar78]) {
LAB_00113006:
                                __assert_fail("(((j->code_buffer) >> (32 - h->size[c])) & stbi__bmask[h->size[c]]) == h->code[c]"
                                              ,
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/DrLSimon[P]glitter/./ext/stb/stb_image.h"
                                              ,0x72d,
                                              "int stbi__jpeg_huff_decode(stbi__jpeg *, stbi__huffman *)"
                                             );
                              }
                              uVar76 = (uVar76 - (int)lVar56) - 9;
                              paVar61 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar76;
                              psVar41->code_bits = uVar76;
                              sVar35 = uVar72 << ((byte)(lVar55 + 10) & 0x1f);
                              psVar41->code_buffer = sVar35;
                            }
                            else {
                              bVar58 = psVar41->huff_ac[iVar71].size[uVar78];
                              uVar76 = psVar41->code_bits - (uint)bVar58;
                              paVar61 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar76;
                              if (psVar41->code_bits < (int)(uint)bVar58) goto LAB_00112562;
                              sVar35 = uVar72 << (bVar58 & 0x1f);
                              psVar41->code_buffer = sVar35;
                              psVar41->code_bits = uVar76;
                            }
                            iVar62 = (int)paVar61;
                            bVar58 = psVar41->huff_ac[iVar71].values[uVar78];
                            bVar26 = bVar58 >> 4;
                            uVar72 = (uint)bVar26;
                            uVar78 = (ulong)uVar72;
                            if ((bVar58 & 0xf) == 1) {
                              if (iVar62 < 1) {
                                stbi__grow_buffer_unsafe(psVar41);
                                sVar35 = psVar41->code_buffer;
                                iVar62 = psVar41->code_bits;
                              }
                              sVar69 = sVar35 * 2;
                              psVar41->code_buffer = sVar69;
                              paVar61 = (anon_struct_96_18_0d0905d3 *)(ulong)(iVar62 - 1U);
                              local_54c._0_2_ =
                                   (short)(((int)~sVar35 >> 0x1f | 1U) << (bVar33 & 0x1f));
                              psVar41->code_bits = iVar62 - 1U;
                            }
                            else {
                              if ((bVar58 & 0xf) != 0) goto LAB_00112562;
                              if (bVar58 < 0xf0) {
                                uVar76 = ~(-1 << bVar26);
                                psVar41->eob_run = uVar76;
                                uVar73 = 0x40;
                                if (0xf < bVar58) {
                                  if (iVar62 < (int)uVar72) {
                                    stbi__grow_buffer_unsafe(psVar41);
                                    sVar35 = psVar41->code_buffer;
                                    iVar62 = psVar41->code_bits;
                                    uVar76 = psVar41->eob_run;
                                  }
                                  uVar59 = sVar35 << bVar26 | sVar35 >> 0x20 - bVar26;
                                  uVar36 = stbi__bmask[uVar78];
                                  sVar69 = ~uVar36 & uVar59;
                                  psVar41->code_buffer = sVar69;
                                  paVar61 = (anon_struct_96_18_0d0905d3 *)(ulong)(iVar62 - uVar72);
                                  psVar41->code_bits = iVar62 - uVar72;
                                  psVar41->eob_run = (uVar59 & uVar36) + uVar76;
                                  local_54c._0_2_ = 0;
                                  uVar78 = uVar73;
                                  goto LAB_0010f370;
                                }
                              }
                              else {
                                uVar73 = 0xf;
                              }
                              local_54c._0_2_ = 0;
                              uVar78 = uVar73;
                              sVar69 = sVar35;
                            }
LAB_0010f370:
                            uVar72 = psVar41->spec_end;
                            uVar73 = (ulong)uVar72;
                            if ((int)uVar63 <= (int)uVar72) {
                              uVar67 = (long)(int)uVar63;
                              do {
                                uVar72 = (uint)uVar73;
                                iVar62 = (int)paVar61;
                                bVar58 = ""[uVar67];
                                if (psVar77[bVar58] == 0) {
                                  if ((int)uVar78 == 0) {
                                    uVar63 = (ulong)((int)uVar67 + 1);
                                    psVar77[bVar58] = (short)local_54c;
                                    break;
                                  }
                                  uVar78 = (ulong)((int)uVar78 - 1);
                                }
                                else {
                                  if (iVar62 < 1) {
                                    stbi__grow_buffer_unsafe(psVar41);
                                    sVar69 = psVar41->code_buffer;
                                    iVar62 = psVar41->code_bits;
                                  }
                                  sVar35 = sVar69 * 2;
                                  psVar41->code_buffer = sVar35;
                                  paVar61 = (anon_struct_96_18_0d0905d3 *)(ulong)(iVar62 - 1U);
                                  psVar41->code_bits = iVar62 - 1U;
                                  bVar80 = (int)sVar69 < 0;
                                  sVar69 = sVar35;
                                  if ((bVar80) &&
                                     (sVar2 = psVar77[bVar58], (iVar38 >> 0x10 & (int)sVar2) == 0))
                                  {
                                    sVar27 = (short)((uint)iVar38 >> 0x10);
                                    if (sVar2 < 1) {
                                      sVar27 = -sVar27;
                                    }
                                    psVar77[bVar58] = sVar2 + sVar27;
                                  }
                                }
                                uVar63 = uVar67 + 1;
                                uVar72 = psVar41->spec_end;
                                uVar73 = (ulong)(int)uVar72;
                                bVar80 = (long)uVar67 < (long)uVar73;
                                uVar67 = uVar63;
                              } while (bVar80);
                            }
                          } while ((int)uVar63 <= (int)uVar72);
                        }
                        else {
                          psVar41->eob_run = iVar38 + -1;
                          if (psVar41->spec_start <= psVar41->spec_end) {
                            uVar72 = (0x10000 << (bVar33 & 0x1f)) >> 0x10;
                            do {
                              bVar33 = ""[uVar63];
                              if (psVar77[bVar33] != 0) {
                                iVar71 = psVar41->code_bits;
                                if (iVar71 < 1) {
                                  stbi__grow_buffer_unsafe(psVar41);
                                  iVar71 = psVar41->code_bits;
                                }
                                sVar35 = psVar41->code_buffer;
                                psVar41->code_buffer = sVar35 * 2;
                                psVar41->code_bits = iVar71 + -1;
                                if (((int)sVar35 < 0) &&
                                   (sVar2 = psVar77[bVar33], (uVar72 & (int)sVar2) == 0)) {
                                  uVar76 = -uVar72;
                                  if (0 < sVar2) {
                                    uVar76 = uVar72;
                                  }
                                  psVar77[bVar33] = (short)uVar76 + sVar2;
                                }
                              }
                              bVar80 = (long)uVar63 < (long)psVar41->spec_end;
                              uVar63 = uVar63 + 1;
                            } while (bVar80);
                          }
                        }
                      }
                      iVar71 = psVar41->todo;
                      psVar41->todo = iVar71 + -1;
                      if (iVar71 < 2) {
                        if (psVar41->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(psVar41);
                        }
                        bVar33 = psVar41->marker;
                        if ((bVar33 & 0xf8) != 0xd0) goto LAB_0010fd7c;
                        psVar41->code_buffer = 0;
                        psVar41->code_bits = 0;
                        psVar41->nomore = 0;
                        psVar41->img_comp[3].dc_pred = 0;
                        psVar41->img_comp[2].dc_pred = 0;
                        psVar41->img_comp[1].dc_pred = 0;
                        psVar41->img_comp[0].dc_pred = 0;
                        psVar41->marker = 0xff;
                        iVar71 = psVar41->restart_interval;
                        if (iVar71 == 0) {
                          iVar71 = 0x7fffffff;
                        }
                        psVar41->todo = iVar71;
                        psVar41->eob_run = 0;
                      }
                      iVar79 = iVar79 + 1;
                    } while (iVar79 != iVar34);
                  }
                  local_4f8 = local_4f8 + 1;
                } while (local_4f8 != local_470);
              }
            }
            else {
              iVar34 = psVar41->img_mcu_y;
              if (0 < iVar34) {
                iVar71 = psVar41->img_mcu_x;
                iVar38 = 0;
                do {
                  if (0 < iVar71) {
                    iVar34 = 0;
                    do {
                      iVar71 = psVar41->scan_n;
                      if (0 < iVar71) {
                        lVar56 = 0;
                        do {
                          iVar79 = psVar41->order[lVar56];
                          iVar62 = psVar41->img_comp[iVar79].v;
                          if (0 < iVar62) {
                            iVar71 = paVar1[iVar79].h;
                            iVar66 = 0;
                            do {
                              if (0 < iVar71) {
                                iVar62 = 0;
                                do {
                                  iVar71 = stbi__jpeg_decode_block_prog_dc
                                                     (psVar41,paVar1[iVar79].coeff +
                                                              (iVar71 * iVar34 + iVar62 +
                                                              (paVar1[iVar79].v * iVar38 + iVar66) *
                                                              paVar1[iVar79].coeff_w) * 0x40,
                                                      (stbi__huffman *)
                                                      psVar41->huff_dc[paVar1[iVar79].hd].fast,
                                                      iVar79);
                                  uVar72 = extraout_EDX_04;
                                  if (iVar71 == 0) goto LAB_00110653;
                                  iVar62 = iVar62 + 1;
                                  iVar71 = paVar1[iVar79].h;
                                } while (iVar62 < iVar71);
                                iVar62 = paVar1[iVar79].v;
                              }
                              iVar66 = iVar66 + 1;
                            } while (iVar66 < iVar62);
                            iVar71 = psVar41->scan_n;
                          }
                          lVar56 = lVar56 + 1;
                        } while (lVar56 < iVar71);
                        iVar79 = psVar41->todo;
                      }
                      psVar41->todo = iVar79 + -1;
                      bVar80 = iVar79 < 2;
                      iVar79 = iVar79 + -1;
                      if (bVar80) {
                        if (psVar41->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(psVar41);
                        }
                        bVar33 = psVar41->marker;
                        if ((bVar33 & 0xf8) != 0xd0) goto LAB_0010fd7c;
                        psVar41->code_buffer = 0;
                        psVar41->code_bits = 0;
                        psVar41->nomore = 0;
                        psVar41->img_comp[3].dc_pred = 0;
                        psVar41->img_comp[2].dc_pred = 0;
                        psVar41->img_comp[1].dc_pred = 0;
                        psVar41->img_comp[0].dc_pred = 0;
                        psVar41->marker = 0xff;
                        iVar79 = psVar41->restart_interval;
                        if (iVar79 == 0) {
                          iVar79 = 0x7fffffff;
                        }
                        psVar41->todo = iVar79;
                        psVar41->eob_run = 0;
                      }
                      iVar34 = iVar34 + 1;
                      iVar71 = psVar41->img_mcu_x;
                    } while (iVar34 < iVar71);
                    iVar34 = psVar41->img_mcu_y;
                  }
                  iVar38 = iVar38 + 1;
                } while (iVar38 < iVar34);
              }
            }
            goto LAB_0010fd71;
          }
          if (psVar50->read_from_callbacks != 0) {
            psVar44 = psVar50->buffer_start;
            iVar79 = (*(psVar50->io).read)(psVar50->io_user_data,(char *)psVar44,psVar50->buflen);
            if (iVar79 == 0) {
              psVar50->read_from_callbacks = 0;
              psVar54 = psVar50->buffer_start + 1;
              psVar50->buffer_start[0] = '\0';
              bVar33 = 0;
            }
            else {
              psVar54 = psVar44 + iVar79;
              bVar33 = *psVar44;
            }
            psVar50->img_buffer_end = psVar54;
            psVar50->img_buffer = psVar50->buffer_start + 1;
            paVar61 = extraout_RDX_00;
            goto LAB_0010eb4a;
          }
          psVar41->scan_n = 0;
LAB_00110645:
          stbi__g_failure_reason = "bad SOS component count";
          goto LAB_0011064c;
        }
        uVar72 = (uint)bVar33;
        if (uVar72 == 0xdc) {
          iVar34 = stbi__get16be(psVar41->s);
          sVar35 = stbi__get16be(psVar41->s);
          if (iVar34 != 4) {
            stbi__g_failure_reason = "bad DNL len";
          }
          if (sVar35 != psVar41->s->img_y) {
            stbi__g_failure_reason = "bad DNL height";
          }
          goto LAB_0010eab8;
        }
        if (uVar72 == 0xd9) {
          psVar50 = psVar41->s;
          uVar72 = psVar50->img_n;
          if (psVar41->progressive == 0) goto LAB_001104e1;
          if ((int)uVar72 < 1) {
            uVar76 = req_comp + (uint)(req_comp == 0);
            bVar80 = false;
          }
          else {
            lVar56 = 0;
            do {
              iVar34 = psVar41->img_comp[lVar56].y + 7 >> 3;
              if (0 < iVar34) {
                uVar72 = paVar1[lVar56].x + 7 >> 3;
                iVar79 = 0;
                do {
                  if (0 < (int)uVar72) {
                    uVar63 = 0;
                    do {
                      psVar77 = paVar1[lVar56].coeff +
                                (paVar1[lVar56].coeff_w * iVar79 + (int)uVar63) * 0x40;
                      iVar71 = paVar1[lVar56].tq;
                      lVar55 = 0;
                      do {
                        psVar77[lVar55] = psVar77[lVar55] * psVar41->dequant[iVar71][lVar55];
                        lVar55 = lVar55 + 1;
                      } while (lVar55 != 0x40);
                      (*psVar41->idct_block_kernel)
                                (paVar1[lVar56].data +
                                 uVar63 * 8 + (long)(iVar79 * 8 * paVar1[lVar56].w2),
                                 paVar1[lVar56].w2,psVar77);
                      uVar63 = uVar63 + 1;
                    } while (uVar63 != uVar72);
                  }
                  iVar79 = iVar79 + 1;
                } while (iVar79 != iVar34);
                psVar50 = psVar41->s;
              }
              lVar56 = lVar56 + 1;
              uVar72 = psVar50->img_n;
            } while (lVar56 < (int)uVar72);
LAB_001104e1:
            uVar76 = (2 < (int)uVar72) + 1 + (uint)(2 < (int)uVar72);
            if (req_comp != 0) {
              uVar76 = req_comp;
            }
            uVar36 = uVar72;
            if (uVar72 == 3) {
              bVar80 = true;
              uVar72 = 3;
              if (psVar41->rgb != 3) {
                uVar36 = 3;
                if (psVar41->app14_color_transform != 0) goto LAB_0011051d;
                bVar80 = psVar41->jfif == 0;
              }
            }
            else {
LAB_0011051d:
              uVar72 = uVar36;
              bVar80 = false;
            }
          }
          uVar36 = 1;
          if (bVar80) {
            uVar36 = uVar72;
          }
          if (uVar72 != 3) {
            uVar36 = uVar72;
          }
          if (2 < (int)uVar76) {
            uVar36 = uVar72;
          }
          sVar35 = psVar50->img_x;
          if (0 < (int)uVar36) {
            lVar56 = 0;
            do {
              pvVar45 = malloc((ulong)(sVar35 + 3));
              *(void **)((long)&psVar41->img_comp[0].linebuf + lVar56 * 2) = pvVar45;
              if (pvVar45 == (void *)0x0) {
                stbi__free_jpeg_components(psVar41,uVar72,why);
                stbi__g_failure_reason = "outofmem";
                psVar47 = (stbi__uint16 *)0x0;
                goto LAB_0011066c;
              }
              uVar63 = (long)psVar41->img_h_max /
                       (long)*(int *)((long)&psVar41->img_comp[0].h + lVar56 * 2);
              iVar34 = (int)uVar63;
              *(int *)((long)local_410 + lVar56 + -0x10) = iVar34;
              iVar79 = psVar41->img_v_max / *(int *)((long)&psVar41->img_comp[0].v + lVar56 * 2);
              *(int *)((long)local_410 + lVar56 + -0xc) = iVar79;
              *(int *)((long)local_410 + lVar56 + -4) = iVar79 >> 1;
              *(int *)((long)local_410 + lVar56 + -8) =
                   (int)((ulong)((sVar35 - 1) + iVar34) / (uVar63 & 0xffffffff));
              *(undefined4 *)((long)local_410 + lVar56) = 0;
              uVar3 = *(undefined8 *)((long)&psVar41->img_comp[0].data + lVar56 * 2);
              *(undefined8 *)((long)local_410 + lVar56 + -0x18) = uVar3;
              *(undefined8 *)((long)local_410 + lVar56 + -0x20) = uVar3;
              if (iVar34 == 2) {
                pcVar46 = stbi__resample_row_h_2;
                if (iVar79 != 1) {
                  if (iVar79 != 2) goto LAB_00111cdd;
                  pcVar46 = psVar41->resample_row_hv_2_kernel;
                }
              }
              else if (iVar34 == 1) {
                pcVar46 = stbi__resample_row_generic;
                if (iVar79 == 2) {
                  pcVar46 = stbi__resample_row_v_2;
                }
                if (iVar79 == 1) {
                  pcVar46 = resample_row_1;
                }
              }
              else {
LAB_00111cdd:
                pcVar46 = stbi__resample_row_generic;
              }
              *(code **)((long)&local_438.s + lVar56) = pcVar46;
              lVar56 = lVar56 + 0x30;
            } while ((ulong)uVar36 * 0x30 != lVar56);
          }
          sVar69 = psVar50->img_y;
          psVar47 = (stbi__uint16 *)stbi__malloc_mad3(uVar76,sVar35,sVar69,1);
          iVar34 = (int)extraout_RDX_02;
          if (psVar47 != (stbi__uint16 *)0x0) {
            if (sVar69 != 0) {
              iVar79 = 0;
              uVar72 = 0;
              uVar63 = extraout_RDX_02;
              do {
                sVar35 = psVar50->img_x;
                if (0 < (int)uVar36) {
                  piVar74 = local_410;
                  uVar78 = 0;
                  piVar68 = &psVar41->img_comp[0].y;
                  do {
                    iVar34 = piVar74[-1];
                    iVar71 = piVar74[-3];
                    iVar38 = iVar71 >> 1;
                    auVar122 = (**(code **)(piVar74 + -10))
                                         (*(stbi_uc **)(piVar68 + 10),
                                          *(undefined8 *)
                                           ((long)piVar74 +
                                           ((ulong)(iVar38 <= iVar34) << 3 | 0xffffffffffffffe0)),
                                          *(undefined8 *)
                                           ((long)piVar74 +
                                           ((ulong)(iVar34 < iVar38) << 3 | 0xffffffffffffffe0)),
                                          piVar74[-2],piVar74[-4]);
                    uVar63 = auVar122._8_8_;
                    *(long *)(&local_498.bpp + uVar78 * 2) = auVar122._0_8_;
                    piVar74[-1] = iVar34 + 1;
                    if (iVar71 <= iVar34 + 1) {
                      piVar74[-1] = 0;
                      *(long *)(piVar74 + -8) = *(long *)(piVar74 + -6);
                      iVar34 = *piVar74;
                      *piVar74 = iVar34 + 1;
                      if (iVar34 + 1 < *piVar68) {
                        *(long *)(piVar74 + -6) = *(long *)(piVar74 + -6) + (long)piVar68[1];
                      }
                    }
                    uVar78 = uVar78 + 1;
                    piVar68 = piVar68 + 0x18;
                    piVar74 = piVar74 + 0xc;
                  } while (uVar36 != uVar78);
                }
                if ((int)uVar76 < 3) {
                  psVar50 = psVar41->s;
                  if (bVar80) {
                    if (uVar76 == 1) {
                      if (psVar50->img_x != 0) {
                        uVar63 = CONCAT44(local_498.mb,local_498.mg);
                        uVar78 = 0;
                        do {
                          bVar33 = *(byte *)(uVar63 + uVar78);
                          *(uchar *)((long)psVar47 + uVar78 + sVar35 * iVar79) =
                               (uchar)((uint)bVar33 * 2 + ((uint)bVar33 + (uint)bVar33 * 8) * 3 +
                                       (uint)*(byte *)(CONCAT44(local_498.mr,local_498.hsz) + uVar78
                                                      ) * 0x96 +
                                       (uint)*(byte *)(CONCAT44(local_498.offset,local_498.bpp) +
                                                      uVar78) * 0x4d >> 8);
                          uVar78 = uVar78 + 1;
                        } while (uVar78 < psVar50->img_x);
                      }
                    }
                    else if (psVar50->img_x != 0) {
                      uVar63 = CONCAT44(local_498.mb,local_498.mg);
                      uVar78 = 0;
                      do {
                        bVar33 = *(byte *)(uVar63 + uVar78);
                        *(uchar *)((long)psVar47 + uVar78 * 2 + (ulong)(sVar35 * iVar79)) =
                             (uchar)((uint)bVar33 * 2 + ((uint)bVar33 + (uint)bVar33 * 8) * 3 +
                                     (uint)*(byte *)(CONCAT44(local_498.mr,local_498.hsz) + uVar78)
                                     * 0x96 + (uint)*(byte *)(CONCAT44(local_498.offset,
                                                                       local_498.bpp) + uVar78) *
                                              0x4d >> 8);
                        *(uchar *)((long)psVar47 + uVar78 * 2 + (ulong)(sVar35 * iVar79) + 1) = 0xff
                        ;
                        uVar78 = uVar78 + 1;
                      } while (uVar78 < psVar50->img_x);
                    }
                  }
                  else if (psVar50->img_n == 4) {
                    if (psVar41->app14_color_transform == 2) {
                      if (psVar50->img_x != 0) {
                        puVar64 = (uchar *)((long)psVar47 + (ulong)(sVar35 * iVar79) + 1);
                        uVar63 = 0;
                        do {
                          iVar34 = (*(byte *)(CONCAT44(local_498.offset,local_498.bpp) + uVar63) ^
                                   0xff) * (uint)*(byte *)(CONCAT44(local_498.all_a,local_498.ma) +
                                                          uVar63);
                          puVar64[-1] = (uchar)((iVar34 + 0x80U >> 8) + iVar34 + 0x80 >> 8);
                          *puVar64 = 0xff;
                          uVar63 = uVar63 + 1;
                          puVar64 = puVar64 + uVar76;
                        } while (uVar63 < psVar50->img_x);
                      }
                    }
                    else {
                      if (psVar41->app14_color_transform != 0) goto LAB_00112162;
                      if (psVar50->img_x != 0) {
                        uVar63 = CONCAT44(local_498.mr,local_498.hsz);
                        puVar64 = (uchar *)((long)psVar47 + (ulong)(sVar35 * iVar79) + 1);
                        uVar78 = 0;
                        do {
                          bVar33 = *(byte *)(CONCAT44(local_498.all_a,local_498.ma) + uVar78);
                          iVar34 = (uint)*(byte *)(CONCAT44(local_498.offset,local_498.bpp) + uVar78
                                                  ) * (uint)bVar33;
                          iVar71 = (uint)*(byte *)(uVar63 + uVar78) * (uint)bVar33;
                          iVar38 = (uint)*(byte *)(CONCAT44(local_498.mb,local_498.mg) + uVar78) *
                                   (uint)bVar33;
                          puVar64[-1] = (uchar)(((iVar38 + 0x80U >> 8) + iVar38 + 0x80 >> 8) * 0x1d
                                                + (iVar71 + (iVar71 + 0x80U >> 8) + 0x80 >> 8) *
                                                  0x96 + (iVar34 + (iVar34 + 0x80U >> 8) + 0x80 >> 8
                                                         ) * 0x4d >> 8);
                          *puVar64 = 0xff;
                          uVar78 = uVar78 + 1;
                          puVar64 = puVar64 + uVar76;
                        } while (uVar78 < psVar50->img_x);
                      }
                    }
                  }
                  else {
LAB_00112162:
                    if (uVar76 == 1) {
                      if (psVar50->img_x != 0) {
                        uVar78 = 0;
                        do {
                          *(uchar *)((long)psVar47 + uVar78 + sVar35 * iVar79) =
                               *(uchar *)(CONCAT44(local_498.offset,local_498.bpp) + uVar78);
                          uVar78 = uVar78 + 1;
                          uVar63 = (ulong)psVar50->img_x;
                        } while (uVar78 < uVar63);
                      }
                    }
                    else if (psVar50->img_x != 0) {
                      uVar78 = 0;
                      do {
                        *(uchar *)((long)psVar47 + uVar78 * 2 + (ulong)(sVar35 * iVar79)) =
                             *(uchar *)(CONCAT44(local_498.offset,local_498.bpp) + uVar78);
                        *(uchar *)((long)psVar47 + uVar78 * 2 + (ulong)(sVar35 * iVar79) + 1) = 0xff
                        ;
                        uVar78 = uVar78 + 1;
                        uVar63 = (ulong)psVar50->img_x;
                      } while (uVar78 < uVar63);
                    }
                  }
                }
                else {
                  psVar54 = (stbi_uc *)((long)psVar47 + (ulong)(uVar72 * uVar76 * sVar35));
                  psVar44 = (stbi_uc *)CONCAT44(local_498.offset,local_498.bpp);
                  psVar50 = psVar41->s;
                  if (psVar50->img_n == 3) {
                    if (bVar80) {
                      if (psVar50->img_x != 0) {
                        puVar64 = (uchar *)((long)psVar47 + (ulong)(sVar35 * iVar79) + 3);
                        uVar63 = 0;
                        do {
                          puVar64[-3] = psVar44[uVar63];
                          puVar64[-2] = *(uchar *)(CONCAT44(local_498.mr,local_498.hsz) + uVar63);
                          puVar64[-1] = *(uchar *)(CONCAT44(local_498.mb,local_498.mg) + uVar63);
                          *puVar64 = 0xff;
                          uVar63 = uVar63 + 1;
                          puVar64 = puVar64 + uVar76;
                        } while (uVar63 < psVar50->img_x);
                      }
                    }
                    else {
LAB_001121d8:
                      (*psVar41->YCbCr_to_RGB_kernel)
                                (psVar54,psVar44,(stbi_uc *)CONCAT44(local_498.mr,local_498.hsz),
                                 (stbi_uc *)CONCAT44(local_498.mb,local_498.mg),psVar50->img_x,
                                 uVar76);
                      psVar50 = psVar41->s;
                      uVar63 = extraout_RDX_03;
                    }
                  }
                  else if (psVar50->img_n == 4) {
                    if (psVar41->app14_color_transform == 2) {
                      (*psVar41->YCbCr_to_RGB_kernel)
                                (psVar54,psVar44,(stbi_uc *)CONCAT44(local_498.mr,local_498.hsz),
                                 (stbi_uc *)CONCAT44(local_498.mb,local_498.mg),psVar50->img_x,
                                 uVar76);
                      psVar50 = psVar41->s;
                      uVar63 = extraout_RDX_04;
                      if (psVar50->img_x != 0) {
                        pbVar65 = (byte *)((long)psVar47 + (ulong)(sVar35 * iVar79) + 2);
                        uVar78 = 0;
                        do {
                          bVar33 = *(byte *)(CONCAT44(local_498.all_a,local_498.ma) + uVar78);
                          iVar34 = (pbVar65[-2] ^ 0xff) * (uint)bVar33;
                          pbVar65[-2] = (byte)((iVar34 + 0x80U >> 8) + iVar34 + 0x80 >> 8);
                          iVar34 = (pbVar65[-1] ^ 0xff) * (uint)bVar33;
                          pbVar65[-1] = (byte)(iVar34 + (iVar34 + 0x80U >> 8) + 0x80 >> 8);
                          iVar34 = (*pbVar65 ^ 0xff) * (uint)bVar33;
                          uVar59 = iVar34 + 0x80U >> 8;
                          uVar63 = (ulong)uVar59;
                          *pbVar65 = (byte)(iVar34 + uVar59 + 0x80 >> 8);
                          uVar78 = uVar78 + 1;
                          pbVar65 = pbVar65 + uVar76;
                        } while (uVar78 < psVar50->img_x);
                      }
                    }
                    else {
                      if (psVar41->app14_color_transform != 0) goto LAB_001121d8;
                      if (psVar50->img_x != 0) {
                        uVar63 = CONCAT44(local_498.mb,local_498.mg);
                        puVar64 = (uchar *)((long)psVar47 + (ulong)(sVar35 * iVar79) + 3);
                        uVar78 = 0;
                        do {
                          bVar33 = *(byte *)(CONCAT44(local_498.all_a,local_498.ma) + uVar78);
                          iVar34 = (uint)psVar44[uVar78] * (uint)bVar33;
                          puVar64[-3] = (uchar)((iVar34 + 0x80U >> 8) + iVar34 + 0x80 >> 8);
                          iVar34 = (uint)*(byte *)(CONCAT44(local_498.mr,local_498.hsz) + uVar78) *
                                   (uint)bVar33;
                          puVar64[-2] = (uchar)(iVar34 + (iVar34 + 0x80U >> 8) + 0x80 >> 8);
                          iVar34 = (uint)*(byte *)(uVar63 + uVar78) * (uint)bVar33;
                          puVar64[-1] = (uchar)(iVar34 + (iVar34 + 0x80U >> 8) + 0x80 >> 8);
                          *puVar64 = 0xff;
                          uVar78 = uVar78 + 1;
                          puVar64 = puVar64 + uVar76;
                        } while (uVar78 < psVar50->img_x);
                      }
                    }
                  }
                  else if (psVar50->img_x != 0) {
                    puVar64 = (uchar *)((long)psVar47 + (ulong)(sVar35 * iVar79) + 3);
                    uVar78 = 0;
                    do {
                      sVar32 = psVar44[uVar78];
                      puVar64[-1] = sVar32;
                      puVar64[-2] = sVar32;
                      puVar64[-3] = sVar32;
                      *puVar64 = 0xff;
                      uVar78 = uVar78 + 1;
                      puVar64 = puVar64 + uVar76;
                    } while (uVar78 < psVar50->img_x);
                  }
                }
                iVar34 = (int)uVar63;
                uVar72 = uVar72 + 1;
                iVar79 = iVar79 + uVar76;
              } while (uVar72 < psVar50->img_y);
              uVar72 = psVar50->img_n;
            }
            stbi__free_jpeg_components(psVar41,uVar72,iVar34);
            psVar50 = psVar41->s;
            *x = psVar50->img_x;
            *y = psVar50->img_y;
            if (comp != (int *)0x0) {
              *comp = (uint)(2 < psVar50->img_n) * 2 + 1;
            }
            goto LAB_0011066c;
          }
          stbi__free_jpeg_components(psVar41,uVar72,iVar34);
          stbi__g_failure_reason = "outofmem";
          goto LAB_00110666;
        }
        iVar34 = stbi__process_marker(psVar41,uVar72);
        uVar72 = extraout_EDX_00;
        if (iVar34 != 0) goto LAB_0010eab8;
      }
LAB_00110653:
      stbi__free_jpeg_components(psVar41,psVar41->s->img_n,uVar72);
LAB_00110666:
      psVar47 = (stbi__uint16 *)0x0;
    }
    else {
      stbi__g_failure_reason = "bad req_comp";
      psVar47 = (stbi__uint16 *)0x0;
    }
LAB_0011066c:
    free(psVar41);
    return psVar47;
  }
  iVar34 = stbi__check_png_header(s);
  psVar54 = s->img_buffer_original;
  psVar44 = s->img_buffer_original_end;
  s->img_buffer = psVar54;
  s->img_buffer_end = psVar44;
  if (iVar34 != 0) {
    if (4 < (uint)req_comp) {
      stbi__g_failure_reason = "bad req_comp";
      return (void *)0x0;
    }
    local_438.s = s;
    iVar34 = stbi__parse_png_file(&local_438,0,req_comp);
    psVar50 = local_438.s;
    if (iVar34 == 0) {
      psVar47 = (stbi__uint16 *)0x0;
      __ptr = (stbi__uint16 *)local_438.out;
    }
    else {
      iVar34 = 8;
      if (8 < local_438.depth) {
        iVar34 = local_438.depth;
      }
      ri->bits_per_channel = iVar34;
      if ((req_comp != 0) && (iVar34 = (local_438.s)->img_out_n, iVar34 != req_comp)) {
        if (local_438.depth < 9) {
          local_438.out =
               stbi__convert_format
                         (local_438.out,iVar34,req_comp,(local_438.s)->img_x,(local_438.s)->img_y);
        }
        else {
          local_438.out =
               (stbi_uc *)
               stbi__convert_format16
                         ((stbi__uint16 *)local_438.out,iVar34,req_comp,(local_438.s)->img_x,
                          (local_438.s)->img_y);
        }
        psVar50->img_out_n = req_comp;
        if ((stbi__uint16 *)local_438.out == (stbi__uint16 *)0x0) {
          return (void *)0x0;
        }
      }
      *x = psVar50->img_x;
      *y = psVar50->img_y;
      if (comp != (int *)0x0) {
        *comp = psVar50->img_n;
      }
      __ptr = (stbi__uint16 *)0x0;
      psVar47 = (stbi__uint16 *)local_438.out;
    }
    free(__ptr);
    free(local_438.expanded);
    psVar41 = (stbi__jpeg *)local_438.idata;
    goto LAB_0011066c;
  }
  if (psVar54 < psVar44) {
    psVar48 = psVar54 + 1;
    s->img_buffer = psVar48;
    sVar32 = *psVar54;
LAB_0010ffa5:
    if (sVar32 != 'B') goto LAB_00110183;
    if (psVar48 < psVar44) {
      s->img_buffer = psVar48 + 1;
      sVar32 = *psVar48;
    }
    else {
      if (s->read_from_callbacks == 0) goto LAB_00110183;
      psVar44 = s->buffer_start;
      iVar34 = (*(s->io).read)(s->io_user_data,(char *)psVar44,s->buflen);
      if (iVar34 == 0) {
        s->read_from_callbacks = 0;
        psVar54 = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
        sVar32 = '\0';
      }
      else {
        psVar54 = psVar44 + iVar34;
        sVar32 = *psVar44;
      }
      s->img_buffer_end = psVar54;
      s->img_buffer = s->buffer_start + 1;
    }
    if (sVar32 != 'M') goto LAB_00110183;
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    uVar72 = stbi__get16le(s);
    iVar34 = stbi__get16le(s);
    uVar72 = iVar34 << 0x10 | uVar72;
    if (((uVar72 < 0x39) && ((0x100010000001000U >> ((ulong)uVar72 & 0x3f) & 1) != 0)) ||
       (uVar72 == 0x6c)) {
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
LAB_001100f4:
      local_498.all_a = 0xff;
      pvVar45 = stbi__bmp_parse_header(s,&local_498);
      if (pvVar45 == (void *)0x0) {
        return (void *)0x0;
      }
      local_454 = s->img_y;
      sVar35 = -local_454;
      if (0 < (int)local_454) {
        sVar35 = local_454;
      }
      s->img_y = sVar35;
      if (local_498.hsz == 0xc) {
        if (local_498.bpp < 0x18) {
          uVar72 = (local_498.offset + -0x26) / 3;
        }
        else {
LAB_0011026b:
          uVar72 = 0;
        }
      }
      else {
        if (0xf < local_498.bpp) goto LAB_0011026b;
        uVar72 = (local_498.offset - local_498.hsz) + -0xe >> 2;
      }
      local_4f0 = local_498.all_a;
      iVar34 = 4 - (uint)(local_498.ma == 0);
      s->img_n = iVar34;
      if (2 < req_comp) {
        iVar34 = req_comp;
      }
      sVar69 = s->img_x;
      iVar79 = stbi__mad3sizes_valid(iVar34,sVar69,sVar35,0);
      if (iVar79 == 0) {
        stbi__g_failure_reason = "too large";
        return (void *)0x0;
      }
      puVar64 = (uchar *)stbi__malloc_mad3(iVar34,sVar69,sVar35,0);
      if (puVar64 == (uchar *)0x0) {
        stbi__g_failure_reason = "outofmem";
        return (void *)0x0;
      }
      if (local_498.bpp < 0x10) {
        if (0x100 < (int)uVar72 || uVar72 == 0) {
          free(puVar64);
          stbi__g_failure_reason = "invalid";
          return (void *)0x0;
        }
        if (0 < (int)uVar72) {
          psVar44 = s->buffer_start;
          psVar54 = s->buffer_start + 1;
          psVar48 = s->img_buffer;
          psVar49 = s->img_buffer_end;
          uVar63 = 0;
          do {
            if (psVar48 < psVar49) {
              s->img_buffer = psVar48 + 1;
              sVar32 = *psVar48;
              psVar48 = psVar48 + 1;
            }
            else if (s->read_from_callbacks == 0) {
              sVar32 = '\0';
            }
            else {
              iVar79 = (*(s->io).read)(s->io_user_data,(char *)psVar44,s->buflen);
              if (iVar79 == 0) {
                s->read_from_callbacks = 0;
                s->buffer_start[0] = '\0';
                sVar32 = '\0';
                psVar49 = psVar54;
              }
              else {
                sVar32 = *psVar44;
                psVar49 = psVar44 + iVar79;
              }
              s->img_buffer_end = psVar49;
              s->img_buffer = psVar54;
              psVar48 = psVar54;
            }
            *(stbi_uc *)((long)&local_438.s + uVar63 * 4 + 2) = sVar32;
            if (psVar48 < psVar49) {
              s->img_buffer = psVar48 + 1;
              sVar32 = *psVar48;
              psVar48 = psVar48 + 1;
            }
            else if (s->read_from_callbacks == 0) {
              sVar32 = '\0';
            }
            else {
              iVar79 = (*(s->io).read)(s->io_user_data,(char *)psVar44,s->buflen);
              if (iVar79 == 0) {
                s->read_from_callbacks = 0;
                s->buffer_start[0] = '\0';
                sVar32 = '\0';
                psVar49 = psVar54;
              }
              else {
                sVar32 = *psVar44;
                psVar49 = psVar44 + iVar79;
              }
              s->img_buffer_end = psVar49;
              s->img_buffer = psVar54;
              psVar48 = psVar54;
            }
            *(stbi_uc *)((long)&local_438.s + uVar63 * 4 + 1) = sVar32;
            if (psVar48 < psVar49) {
              s->img_buffer = psVar48 + 1;
              sVar32 = *psVar48;
              psVar48 = psVar48 + 1;
            }
            else if (s->read_from_callbacks == 0) {
              sVar32 = '\0';
            }
            else {
              iVar79 = (*(s->io).read)(s->io_user_data,(char *)psVar44,s->buflen);
              if (iVar79 == 0) {
                s->read_from_callbacks = 0;
                s->buffer_start[0] = '\0';
                sVar32 = '\0';
                psVar49 = psVar54;
              }
              else {
                sVar32 = *psVar44;
                psVar49 = psVar44 + iVar79;
              }
              s->img_buffer_end = psVar49;
              s->img_buffer = psVar54;
              psVar48 = psVar54;
            }
            *(stbi_uc *)((long)&local_438.s + uVar63 * 4) = sVar32;
            if (local_498.hsz != 0xc) {
              if (psVar48 < psVar49) {
                psVar48 = psVar48 + 1;
              }
              else {
                if (s->read_from_callbacks == 0) goto LAB_00110869;
                iVar79 = (*(s->io).read)(s->io_user_data,(char *)psVar44,s->buflen);
                if (iVar79 == 0) {
                  s->read_from_callbacks = 0;
                  s->buffer_start[0] = '\0';
                  psVar49 = psVar54;
                }
                else {
                  psVar49 = psVar44 + iVar79;
                }
                s->img_buffer_end = psVar49;
                psVar48 = psVar54;
              }
              s->img_buffer = psVar48;
            }
LAB_00110869:
            *(undefined1 *)((long)&local_438.s + uVar63 * 4 + 3) = 0xff;
            uVar63 = uVar63 + 1;
          } while (uVar72 != uVar63);
        }
        stbi__skip(s,(uVar72 * (local_498.hsz == 0xc | 0xfffffffc) - local_498.hsz) +
                     local_498.offset + -0xe);
        if (local_498.bpp == 8) {
          uVar72 = s->img_x;
        }
        else {
          if (local_498.bpp != 4) {
            free(puVar64);
            stbi__g_failure_reason = "bad bpp";
            return (void *)0x0;
          }
          uVar72 = s->img_x + 1 >> 1;
        }
        sVar35 = s->img_y;
        if (0 < (int)sVar35) {
          local_518 = -uVar72 & 3;
          psVar44 = s->buffer_start;
          psVar54 = s->buffer_start + 1;
          uVar63 = 0;
          iVar79 = 0;
          do {
            if (0 < (int)s->img_x) {
              psVar48 = s->img_buffer;
              psVar49 = s->img_buffer_end;
              iVar71 = 0;
              do {
                if (psVar48 < psVar49) {
                  s->img_buffer = psVar48 + 1;
                  bVar33 = *psVar48;
                  psVar48 = psVar48 + 1;
                }
                else if (s->read_from_callbacks == 0) {
                  bVar33 = 0;
                }
                else {
                  iVar38 = (*(s->io).read)(s->io_user_data,(char *)psVar44,s->buflen);
                  if (iVar38 == 0) {
                    s->read_from_callbacks = 0;
                    s->buffer_start[0] = '\0';
                    bVar33 = 0;
                    psVar49 = psVar54;
                  }
                  else {
                    bVar33 = *psVar44;
                    psVar49 = psVar44 + iVar38;
                  }
                  s->img_buffer_end = psVar49;
                  s->img_buffer = psVar54;
                  psVar48 = psVar54;
                }
                uVar76 = bVar33 & 0xf;
                uVar72 = (uint)(bVar33 >> 4);
                if (local_498.bpp != 4) {
                  uVar72 = (uint)bVar33;
                }
                uVar78 = (ulong)uVar72;
                if (local_498.bpp != 4) {
                  uVar76 = 0;
                }
                lVar56 = (long)(int)uVar63;
                uVar73 = lVar56 + 3;
                puVar64[lVar56] = *(uchar *)((long)&local_438.s + uVar78 * 4);
                puVar64[lVar56 + 1] = *(uchar *)((long)&local_438.s + uVar78 * 4 + 1);
                puVar64[lVar56 + 2] = *(uchar *)((long)&local_438.s + uVar78 * 4 + 2);
                if (iVar34 == 4) {
                  puVar64[lVar56 + 3] = 0xff;
                  uVar73 = (ulong)((int)uVar63 + 4);
                }
                if (iVar71 + 1U == s->img_x) {
                  uVar63 = uVar73 & 0xffffffff;
                  break;
                }
                if (local_498.bpp == 8) {
                  if (psVar48 < psVar49) {
                    s->img_buffer = psVar48 + 1;
                    bVar33 = *psVar48;
                    psVar48 = psVar48 + 1;
                  }
                  else if (s->read_from_callbacks == 0) {
                    bVar33 = 0;
                  }
                  else {
                    iVar38 = (*(s->io).read)(s->io_user_data,(char *)psVar44,s->buflen);
                    if (iVar38 == 0) {
                      s->read_from_callbacks = 0;
                      s->buffer_start[0] = '\0';
                      bVar33 = 0;
                      psVar49 = psVar54;
                    }
                    else {
                      bVar33 = *psVar44;
                      psVar49 = psVar44 + iVar38;
                    }
                    s->img_buffer_end = psVar49;
                    s->img_buffer = psVar54;
                    psVar48 = psVar54;
                  }
                  uVar76 = (uint)bVar33;
                }
                lVar56 = (long)(int)uVar73;
                uVar63 = lVar56 + 3;
                uVar78 = (ulong)uVar76;
                puVar64[lVar56] = *(uchar *)((long)&local_438.s + uVar78 * 4);
                puVar64[lVar56 + 1] = *(uchar *)((long)&local_438.s + uVar78 * 4 + 1);
                puVar64[lVar56 + 2] = *(uchar *)((long)&local_438.s + uVar78 * 4 + 2);
                if (iVar34 == 4) {
                  puVar64[lVar56 + 3] = 0xff;
                  uVar63 = (ulong)((int)uVar73 + 4);
                }
                iVar71 = iVar71 + 2;
              } while (iVar71 < (int)s->img_x);
            }
            stbi__skip(s,local_518);
            iVar79 = iVar79 + 1;
            sVar35 = s->img_y;
          } while (iVar79 < (int)sVar35);
        }
        goto LAB_00111365;
      }
      stbi__skip(s,(local_498.offset - local_498.hsz) + -0xe);
      if (local_498.bpp == 0x10) {
        uVar72 = s->img_x * 2 & 2;
        local_4a4 = uVar72;
LAB_001109dd:
        auVar82._0_4_ = -(uint)(local_498.mg == 0);
        auVar82._4_4_ = -(uint)(local_498.mg == 0);
        auVar82._8_4_ = -(uint)(local_498.mr == 0);
        auVar82._12_4_ = -(uint)(local_498.mr == 0);
        iVar79 = movmskpd(uVar72,auVar82);
        if (local_498.mb == 0 || iVar79 != 0) {
          free(puVar64);
          stbi__g_failure_reason = "bad masks";
          return (void *)0x0;
        }
        iVar79 = stbi__high_bit(local_498.mb);
        iVar79 = iVar79 + -7;
        local_528 = CONCAT44(local_498.mb,local_498.mg) & 0x5555555555555555;
        iVar71 = stbi__high_bit(local_498.mg);
        iVar71 = iVar71 + -7;
        local_54c = stbi__high_bit(local_498.mb);
        local_54c = local_54c + -7;
        local_4a0 = stbi__high_bit(local_498.ma);
        local_4a0 = local_4a0 + -7;
        local_528._0_4_ = (local_498.mg >> 1 & 0x55555555) + (uint)local_528;
        uVar76 = (local_498.mb >> 1 & 0x55555555) + local_528._4_4_;
        uVar36 = (local_498.mg >> 1 & 0x55555555) + (local_498.mg & 0x55555555);
        uVar59 = (local_498.mr >> 1 & 0x55555555) + (local_498.mr & 0x55555555);
        uVar72 = ((uint)local_528 >> 2 & 0x33333333) + ((uint)local_528 & 0x33333333);
        uVar76 = (uVar76 >> 2 & 0x33333333) + (uVar76 & 0x33333333);
        uVar36 = (uVar36 >> 2 & 0x33333333) + (uVar36 & 0x33333333);
        uVar59 = (uVar59 >> 2 & 0x33333333) + (uVar59 & 0x33333333);
        auVar83._0_4_ = (uVar72 >> 4) + uVar72;
        auVar83._4_4_ = (uVar76 >> 4) + uVar76;
        auVar83._8_4_ = (uVar36 >> 4) + uVar36;
        auVar83._12_4_ = (uVar59 >> 4) + uVar59;
        in_XMM1 = auVar83 & _DAT_00128150;
        in_XMM2._0_4_ = (in_XMM1._0_4_ >> 8) + in_XMM1._0_4_;
        in_XMM2._4_4_ = (in_XMM1._4_4_ >> 8) + in_XMM1._4_4_;
        in_XMM2._8_4_ = (in_XMM1._8_4_ >> 8) + in_XMM1._8_4_;
        in_XMM2._12_4_ = (in_XMM1._12_4_ >> 8) + in_XMM1._12_4_;
        uVar72 = (in_XMM2._0_4_ >> 0x10) + in_XMM2._0_4_ & 0x3f;
        uVar76 = (in_XMM2._4_4_ >> 0x10) + in_XMM2._4_4_ & 0x3f;
        uVar36 = (in_XMM2._8_4_ >> 0x10) + in_XMM2._8_4_ & 0x3f;
        uVar59 = (in_XMM2._12_4_ >> 0x10) + in_XMM2._12_4_ & 0x3f;
        local_474 = (undefined4)CONCAT71((uint7)(uint3)((uint)local_4a0 >> 8),1);
        bVar80 = false;
      }
      else {
        if (local_498.bpp == 0x20) {
          auVar122._0_4_ = -(uint)(local_498.mg == 0xff000000);
          auVar122._4_4_ = -(uint)(local_498.mb == 0xff);
          auVar122._8_4_ = -(uint)(local_498.mg == 0xff00);
          auVar122._12_4_ = -(uint)(local_498.mr == 0xff0000);
          uVar72 = movmskps(extraout_EAX,auVar122);
          local_4a4 = 0;
          uVar72 = uVar72 ^ 0xf;
          if (uVar72 != 0) goto LAB_001109dd;
          bVar80 = true;
        }
        else {
          local_4a4 = 0;
          uVar72 = extraout_EAX;
          if (local_498.bpp != 0x18) goto LAB_001109dd;
          local_4a4 = s->img_x & 3;
          bVar80 = false;
        }
        uVar72 = 0;
        uVar76 = 0;
        uVar36 = 0;
        uVar59 = 0;
        local_474 = 0;
        iVar79 = 0;
        iVar71 = 0;
        local_54c = 0;
        local_4a0 = 0;
      }
      sVar35 = s->img_y;
      if (0 < (int)sVar35) {
        psVar44 = s->buffer_start;
        psVar54 = s->buffer_start + 1;
        local_468 = (anon_struct_96_18_0d0905d3 *)CONCAT44(local_468._4_4_,-iVar79);
        local_460 = CONCAT44(local_460._4_4_,-local_54c);
        local_448 = -local_4a0;
        auVar84._0_4_ = -(uint)(-0x7ffffff9 < (int)(uVar72 ^ 0x80000000));
        auVar84._4_4_ = -(uint)(-0x7ffffff9 < (int)(uVar76 ^ 0x80000000));
        auVar84._8_4_ = -(uint)(-0x7ffffff9 < (int)(uVar36 ^ 0x80000000));
        auVar84._12_4_ = -(uint)(-0x7ffffff9 < (int)(uVar59 ^ 0x80000000));
        local_44c = movmskps(local_448,auVar84);
        local_44c = local_44c ^ 0xf;
        local_470 = CONCAT31(local_470._1_3_,(byte)local_44c >> 3);
        uVar28 = local_44c & 4;
        uVar39 = local_44c & 2;
        in_XMM2._4_4_ = local_498.mb;
        in_XMM2._0_4_ = local_498.mg;
        in_XMM2._8_4_ = local_498.mg;
        in_XMM2._12_4_ = local_498.mr;
        local_440 = local_498.mg;
        local_43c = local_498.mr;
        in_XMM1._4_4_ = uVar76;
        in_XMM1._0_4_ = uVar76;
        in_XMM1._8_4_ = uVar76;
        in_XMM1._12_4_ = uVar76;
        local_518 = 0;
        iVar38 = 0;
        local_46c = uVar72;
        local_444 = local_498.mb;
        do {
          local_450 = iVar38;
          if ((char)local_474 == '\0') {
            if (0 < (int)s->img_x) {
              psVar48 = s->img_buffer;
              psVar49 = s->img_buffer_end;
              iVar38 = 0;
              do {
                if (psVar48 < psVar49) {
                  s->img_buffer = psVar48 + 1;
                  bVar33 = *psVar48;
                  psVar48 = psVar48 + 1;
                }
                else if (s->read_from_callbacks == 0) {
                  bVar33 = 0;
                }
                else {
                  iVar62 = (*(s->io).read)(s->io_user_data,(char *)psVar44,s->buflen);
                  if (iVar62 == 0) {
                    s->read_from_callbacks = 0;
                    s->buffer_start[0] = '\0';
                    bVar33 = 0;
                    psVar49 = psVar54;
                  }
                  else {
                    bVar33 = *psVar44;
                    psVar49 = psVar44 + iVar62;
                  }
                  s->img_buffer_end = psVar49;
                  s->img_buffer = psVar54;
                  psVar48 = psVar54;
                }
                lVar56 = (long)(int)local_518;
                puVar64[lVar56 + 2] = bVar33;
                if (psVar48 < psVar49) {
                  s->img_buffer = psVar48 + 1;
                  bVar33 = *psVar48;
                  psVar48 = psVar48 + 1;
                }
                else if (s->read_from_callbacks == 0) {
                  bVar33 = 0;
                }
                else {
                  iVar62 = (*(s->io).read)(s->io_user_data,(char *)psVar44,s->buflen);
                  if (iVar62 == 0) {
                    s->read_from_callbacks = 0;
                    s->buffer_start[0] = '\0';
                    bVar33 = 0;
                    psVar49 = psVar54;
                  }
                  else {
                    bVar33 = *psVar44;
                    psVar49 = psVar44 + iVar62;
                  }
                  s->img_buffer_end = psVar49;
                  s->img_buffer = psVar54;
                  psVar48 = psVar54;
                }
                puVar64[lVar56 + 1] = bVar33;
                if (psVar48 < psVar49) {
                  s->img_buffer = psVar48 + 1;
                  bVar33 = *psVar48;
                  psVar48 = psVar48 + 1;
                }
                else if (s->read_from_callbacks == 0) {
                  bVar33 = 0;
                }
                else {
                  iVar62 = (*(s->io).read)(s->io_user_data,(char *)psVar44,s->buflen);
                  if (iVar62 == 0) {
                    s->read_from_callbacks = 0;
                    s->buffer_start[0] = '\0';
                    bVar33 = 0;
                    psVar49 = psVar54;
                  }
                  else {
                    bVar33 = *psVar44;
                    psVar49 = psVar44 + iVar62;
                  }
                  s->img_buffer_end = psVar49;
                  s->img_buffer = psVar54;
                  psVar48 = psVar54;
                }
                puVar64[lVar56] = bVar33;
                bVar33 = 0xff;
                if (bVar80) {
                  if (psVar48 < psVar49) {
                    s->img_buffer = psVar48 + 1;
                    bVar33 = *psVar48;
                    psVar48 = psVar48 + 1;
                  }
                  else if (s->read_from_callbacks == 0) {
                    bVar33 = 0;
                  }
                  else {
                    iVar62 = (*(s->io).read)(s->io_user_data,(char *)psVar44,s->buflen);
                    if (iVar62 == 0) {
                      s->read_from_callbacks = 0;
                      s->buffer_start[0] = '\0';
                      bVar33 = 0;
                      psVar49 = psVar54;
                    }
                    else {
                      bVar33 = *psVar44;
                      psVar49 = psVar44 + iVar62;
                    }
                    s->img_buffer_end = psVar49;
                    s->img_buffer = psVar54;
                    psVar48 = psVar54;
                  }
                }
                iVar62 = local_518 + 3;
                if (iVar34 == 4) {
                  puVar64[lVar56 + 3] = bVar33;
                  iVar62 = local_518 + 4;
                }
                local_518 = iVar62;
                local_4f0 = local_4f0 | bVar33;
                iVar38 = iVar38 + 1;
              } while (iVar38 < (int)s->img_x);
            }
          }
          else if (0 < (int)s->img_x) {
            iVar38 = 0;
            do {
              uVar72 = stbi__get16le(s);
              if (local_498.bpp != 0x10) {
                iVar62 = stbi__get16le(s);
                uVar72 = uVar72 | iVar62 << 0x10;
              }
              iVar62 = (int)(uVar72 & local_43c) >> ((byte)iVar79 & 0x1f);
              if (iVar79 < 0) {
                iVar62 = (uVar72 & local_43c) << ((byte)local_468 & 0x1f);
              }
              uVar52 = uVar59;
              iVar66 = iVar62;
              if ((char)local_470 == '\0') {
                uVar57 = (uchar)iVar62;
              }
              else {
                do {
                  iVar66 = iVar66 + (iVar62 >> ((byte)uVar52 & 0x1f));
                  uVar57 = (uchar)iVar66;
                  uVar52 = uVar52 + uVar59;
                } while (uVar52 < 8);
              }
              lVar56 = (long)(int)local_518;
              puVar64[lVar56] = uVar57;
              iVar62 = (int)(uVar72 & local_440) >> ((byte)iVar71 & 0x1f);
              if (iVar71 < 0) {
                iVar62 = (uVar72 & local_440) << (-(byte)iVar71 & 0x1f);
              }
              uVar52 = uVar36;
              iVar66 = iVar62;
              if (uVar28 == 0) {
                uVar57 = (uchar)iVar62;
              }
              else {
                do {
                  iVar66 = iVar66 + (iVar62 >> ((byte)uVar52 & 0x1f));
                  uVar57 = (uchar)iVar66;
                  uVar52 = uVar52 + uVar36;
                } while (uVar52 < 8);
              }
              puVar64[lVar56 + 1] = uVar57;
              iVar62 = (int)(uVar72 & local_444) >> ((byte)local_54c & 0x1f);
              if (local_54c < 0) {
                iVar62 = (uVar72 & local_444) << ((byte)local_460 & 0x1f);
              }
              uVar52 = uVar76;
              iVar66 = iVar62;
              if (uVar39 == 0) {
                uVar57 = (uchar)iVar62;
              }
              else {
                do {
                  iVar66 = iVar66 + (iVar62 >> ((byte)uVar52 & 0x1f));
                  uVar57 = (uchar)iVar66;
                  uVar52 = uVar52 + uVar76;
                } while (uVar52 < 8);
              }
              puVar64[lVar56 + 2] = uVar57;
              if (local_498.ma == 0) {
                uVar72 = 0xff;
              }
              else {
                uVar52 = (int)(uVar72 & local_498.ma) >> ((byte)local_4a0 & 0x1f);
                if (local_4a0 < 0) {
                  uVar52 = (uVar72 & local_498.ma) << ((byte)local_448 & 0x1f);
                }
                uVar72 = uVar52;
                uVar53 = local_46c;
                if ((local_44c & 1) != 0) {
                  do {
                    uVar72 = uVar72 + ((int)uVar52 >> ((byte)uVar53 & 0x1f));
                    uVar53 = uVar53 + local_46c;
                  } while (uVar53 < 8);
                }
              }
              iVar62 = local_518 + 3;
              if (iVar34 == 4) {
                puVar64[lVar56 + 3] = (uchar)uVar72;
                iVar62 = local_518 + 4;
              }
              local_518 = iVar62;
              local_4f0 = local_4f0 | uVar72;
              iVar38 = iVar38 + 1;
            } while (iVar38 < (int)s->img_x);
          }
          stbi__skip(s,local_4a4);
          iVar38 = local_450 + 1;
          sVar35 = s->img_y;
        } while (iVar38 < (int)sVar35);
      }
LAB_00111365:
      auVar31 = _DAT_001281f0;
      auVar30 = _DAT_001281e0;
      auVar29 = _DAT_001281d0;
      auVar84 = _DAT_001281c0;
      auVar83 = _DAT_001281b0;
      auVar82 = _DAT_001281a0;
      auVar122 = _DAT_00128110;
      if (((iVar34 == 4) && (local_4f0 == 0)) &&
         (uVar72 = s->img_x * sVar35 * 4 - 1, -1 < (int)uVar72)) {
        uVar76 = uVar72 >> 2;
        auVar81._4_4_ = 0;
        auVar81._0_4_ = uVar76;
        auVar81._8_4_ = uVar76;
        auVar81._12_4_ = 0;
        puVar43 = puVar64 + uVar72;
        uVar63 = 0;
        do {
          auVar102._8_4_ = (int)uVar63;
          auVar102._0_8_ = uVar63;
          auVar102._12_4_ = (int)(uVar63 >> 0x20);
          auVar104 = auVar81 | auVar122;
          auVar106 = (auVar102 | auVar31) ^ auVar122;
          iVar79 = auVar104._0_4_;
          iVar66 = -(uint)(iVar79 < auVar106._0_4_);
          iVar71 = auVar104._4_4_;
          auVar108._4_4_ = -(uint)(iVar71 < auVar106._4_4_);
          iVar38 = auVar104._8_4_;
          iVar37 = -(uint)(iVar38 < auVar106._8_4_);
          iVar62 = auVar104._12_4_;
          auVar108._12_4_ = -(uint)(iVar62 < auVar106._12_4_);
          auVar85._4_4_ = iVar66;
          auVar85._0_4_ = iVar66;
          auVar85._8_4_ = iVar37;
          auVar85._12_4_ = iVar37;
          auVar85 = pshuflw(in_XMM1,auVar85,0xe8);
          auVar107._4_4_ = -(uint)(auVar106._4_4_ == iVar71);
          auVar107._12_4_ = -(uint)(auVar106._12_4_ == iVar62);
          auVar107._0_4_ = auVar107._4_4_;
          auVar107._8_4_ = auVar107._12_4_;
          auVar94 = pshuflw(in_XMM2,auVar107,0xe8);
          auVar108._0_4_ = auVar108._4_4_;
          auVar108._8_4_ = auVar108._12_4_;
          auVar106 = pshuflw(auVar85,auVar108,0xe8);
          auVar104._8_4_ = 0xffffffff;
          auVar104._0_8_ = 0xffffffffffffffff;
          auVar104._12_4_ = 0xffffffff;
          auVar104 = (auVar106 | auVar94 & auVar85) ^ auVar104;
          auVar104 = packssdw(auVar104,auVar104);
          if ((auVar104 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *puVar43 = 0xff;
          }
          auVar94._4_4_ = iVar66;
          auVar94._0_4_ = iVar66;
          auVar94._8_4_ = iVar37;
          auVar94._12_4_ = iVar37;
          auVar108 = auVar107 & auVar94 | auVar108;
          auVar104 = packssdw(auVar108,auVar108);
          auVar106._8_4_ = 0xffffffff;
          auVar106._0_8_ = 0xffffffffffffffff;
          auVar106._12_4_ = 0xffffffff;
          auVar104 = packssdw(auVar104 ^ auVar106,auVar104 ^ auVar106);
          auVar104 = packsswb(auVar104,auVar104);
          if ((auVar104._0_4_ >> 8 & 1) != 0) {
            puVar43[-4] = 0xff;
          }
          auVar104 = (auVar102 | auVar30) ^ auVar122;
          auVar95._0_4_ = -(uint)(iVar79 < auVar104._0_4_);
          auVar95._4_4_ = -(uint)(iVar71 < auVar104._4_4_);
          auVar95._8_4_ = -(uint)(iVar38 < auVar104._8_4_);
          auVar95._12_4_ = -(uint)(iVar62 < auVar104._12_4_);
          auVar109._4_4_ = auVar95._0_4_;
          auVar109._0_4_ = auVar95._0_4_;
          auVar109._8_4_ = auVar95._8_4_;
          auVar109._12_4_ = auVar95._8_4_;
          iVar66 = -(uint)(auVar104._4_4_ == iVar71);
          iVar37 = -(uint)(auVar104._12_4_ == iVar62);
          auVar14._4_4_ = iVar66;
          auVar14._0_4_ = iVar66;
          auVar14._8_4_ = iVar37;
          auVar14._12_4_ = iVar37;
          auVar119._4_4_ = auVar95._4_4_;
          auVar119._0_4_ = auVar95._4_4_;
          auVar119._8_4_ = auVar95._12_4_;
          auVar119._12_4_ = auVar95._12_4_;
          auVar104 = auVar14 & auVar109 | auVar119;
          auVar104 = packssdw(auVar104,auVar104);
          auVar5._8_4_ = 0xffffffff;
          auVar5._0_8_ = 0xffffffffffffffff;
          auVar5._12_4_ = 0xffffffff;
          auVar104 = packssdw(auVar104 ^ auVar5,auVar104 ^ auVar5);
          auVar104 = packsswb(auVar104,auVar104);
          if ((auVar104._0_4_ >> 0x10 & 1) != 0) {
            puVar43[-8] = 0xff;
          }
          auVar104 = pshufhw(auVar104,auVar109,0x84);
          auVar15._4_4_ = iVar66;
          auVar15._0_4_ = iVar66;
          auVar15._8_4_ = iVar37;
          auVar15._12_4_ = iVar37;
          auVar106 = pshufhw(auVar95,auVar15,0x84);
          auVar85 = pshufhw(auVar104,auVar119,0x84);
          auVar86._8_4_ = 0xffffffff;
          auVar86._0_8_ = 0xffffffffffffffff;
          auVar86._12_4_ = 0xffffffff;
          auVar86 = (auVar85 | auVar106 & auVar104) ^ auVar86;
          auVar104 = packssdw(auVar86,auVar86);
          auVar104 = packsswb(auVar104,auVar104);
          if ((auVar104._0_4_ >> 0x18 & 1) != 0) {
            puVar43[-0xc] = 0xff;
          }
          auVar104 = (auVar102 | auVar29) ^ auVar122;
          auVar96._0_4_ = -(uint)(iVar79 < auVar104._0_4_);
          auVar96._4_4_ = -(uint)(iVar71 < auVar104._4_4_);
          auVar96._8_4_ = -(uint)(iVar38 < auVar104._8_4_);
          auVar96._12_4_ = -(uint)(iVar62 < auVar104._12_4_);
          auVar16._4_4_ = auVar96._0_4_;
          auVar16._0_4_ = auVar96._0_4_;
          auVar16._8_4_ = auVar96._8_4_;
          auVar16._12_4_ = auVar96._8_4_;
          auVar106 = pshuflw(auVar119,auVar16,0xe8);
          auVar87._0_4_ = -(uint)(auVar104._0_4_ == iVar79);
          auVar87._4_4_ = -(uint)(auVar104._4_4_ == iVar71);
          auVar87._8_4_ = -(uint)(auVar104._8_4_ == iVar38);
          auVar87._12_4_ = -(uint)(auVar104._12_4_ == iVar62);
          auVar110._4_4_ = auVar87._4_4_;
          auVar110._0_4_ = auVar87._4_4_;
          auVar110._8_4_ = auVar87._12_4_;
          auVar110._12_4_ = auVar87._12_4_;
          auVar104 = pshuflw(auVar87,auVar110,0xe8);
          auVar111._4_4_ = auVar96._4_4_;
          auVar111._0_4_ = auVar96._4_4_;
          auVar111._8_4_ = auVar96._12_4_;
          auVar111._12_4_ = auVar96._12_4_;
          auVar85 = pshuflw(auVar96,auVar111,0xe8);
          auVar6._8_4_ = 0xffffffff;
          auVar6._0_8_ = 0xffffffffffffffff;
          auVar6._12_4_ = 0xffffffff;
          auVar104 = packssdw(auVar104 & auVar106,(auVar85 | auVar104 & auVar106) ^ auVar6);
          auVar104 = packsswb(auVar104,auVar104);
          if ((auVar104 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            puVar43[-0x10] = 0xff;
          }
          auVar17._4_4_ = auVar96._0_4_;
          auVar17._0_4_ = auVar96._0_4_;
          auVar17._8_4_ = auVar96._8_4_;
          auVar17._12_4_ = auVar96._8_4_;
          auVar111 = auVar110 & auVar17 | auVar111;
          auVar85 = packssdw(auVar111,auVar111);
          auVar7._8_4_ = 0xffffffff;
          auVar7._0_8_ = 0xffffffffffffffff;
          auVar7._12_4_ = 0xffffffff;
          auVar104 = packssdw(auVar104,auVar85 ^ auVar7);
          auVar104 = packsswb(auVar104,auVar104);
          if ((auVar104._4_2_ >> 8 & 1) != 0) {
            puVar43[-0x14] = 0xff;
          }
          auVar104 = (auVar102 | auVar84) ^ auVar122;
          auVar97._0_4_ = -(uint)(iVar79 < auVar104._0_4_);
          auVar97._4_4_ = -(uint)(iVar71 < auVar104._4_4_);
          auVar97._8_4_ = -(uint)(iVar38 < auVar104._8_4_);
          auVar97._12_4_ = -(uint)(iVar62 < auVar104._12_4_);
          auVar112._4_4_ = auVar97._0_4_;
          auVar112._0_4_ = auVar97._0_4_;
          auVar112._8_4_ = auVar97._8_4_;
          auVar112._12_4_ = auVar97._8_4_;
          iVar66 = -(uint)(auVar104._4_4_ == iVar71);
          iVar37 = -(uint)(auVar104._12_4_ == iVar62);
          auVar18._4_4_ = iVar66;
          auVar18._0_4_ = iVar66;
          auVar18._8_4_ = iVar37;
          auVar18._12_4_ = iVar37;
          auVar120._4_4_ = auVar97._4_4_;
          auVar120._0_4_ = auVar97._4_4_;
          auVar120._8_4_ = auVar97._12_4_;
          auVar120._12_4_ = auVar97._12_4_;
          auVar104 = auVar18 & auVar112 | auVar120;
          auVar104 = packssdw(auVar104,auVar104);
          auVar8._8_4_ = 0xffffffff;
          auVar8._0_8_ = 0xffffffffffffffff;
          auVar8._12_4_ = 0xffffffff;
          auVar104 = packssdw(auVar104 ^ auVar8,auVar104 ^ auVar8);
          auVar104 = packsswb(auVar104,auVar104);
          if ((auVar104 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            puVar43[-0x18] = 0xff;
          }
          auVar104 = pshufhw(auVar104,auVar112,0x84);
          auVar19._4_4_ = iVar66;
          auVar19._0_4_ = iVar66;
          auVar19._8_4_ = iVar37;
          auVar19._12_4_ = iVar37;
          auVar106 = pshufhw(auVar97,auVar19,0x84);
          auVar85 = pshufhw(auVar104,auVar120,0x84);
          auVar88._8_4_ = 0xffffffff;
          auVar88._0_8_ = 0xffffffffffffffff;
          auVar88._12_4_ = 0xffffffff;
          auVar88 = (auVar85 | auVar106 & auVar104) ^ auVar88;
          auVar104 = packssdw(auVar88,auVar88);
          auVar104 = packsswb(auVar104,auVar104);
          if ((auVar104._6_2_ >> 8 & 1) != 0) {
            puVar43[-0x1c] = 0xff;
          }
          auVar104 = (auVar102 | auVar83) ^ auVar122;
          auVar98._0_4_ = -(uint)(iVar79 < auVar104._0_4_);
          auVar98._4_4_ = -(uint)(iVar71 < auVar104._4_4_);
          auVar98._8_4_ = -(uint)(iVar38 < auVar104._8_4_);
          auVar98._12_4_ = -(uint)(iVar62 < auVar104._12_4_);
          auVar20._4_4_ = auVar98._0_4_;
          auVar20._0_4_ = auVar98._0_4_;
          auVar20._8_4_ = auVar98._8_4_;
          auVar20._12_4_ = auVar98._8_4_;
          auVar106 = pshuflw(auVar120,auVar20,0xe8);
          auVar89._0_4_ = -(uint)(auVar104._0_4_ == iVar79);
          auVar89._4_4_ = -(uint)(auVar104._4_4_ == iVar71);
          auVar89._8_4_ = -(uint)(auVar104._8_4_ == iVar38);
          auVar89._12_4_ = -(uint)(auVar104._12_4_ == iVar62);
          auVar113._4_4_ = auVar89._4_4_;
          auVar113._0_4_ = auVar89._4_4_;
          auVar113._8_4_ = auVar89._12_4_;
          auVar113._12_4_ = auVar89._12_4_;
          auVar104 = pshuflw(auVar89,auVar113,0xe8);
          auVar114._4_4_ = auVar98._4_4_;
          auVar114._0_4_ = auVar98._4_4_;
          auVar114._8_4_ = auVar98._12_4_;
          auVar114._12_4_ = auVar98._12_4_;
          auVar85 = pshuflw(auVar98,auVar114,0xe8);
          auVar99._8_4_ = 0xffffffff;
          auVar99._0_8_ = 0xffffffffffffffff;
          auVar99._12_4_ = 0xffffffff;
          auVar99 = (auVar85 | auVar104 & auVar106) ^ auVar99;
          auVar85 = packssdw(auVar99,auVar99);
          auVar104 = packsswb(auVar104 & auVar106,auVar85);
          if ((auVar104 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            puVar43[-0x20] = 0xff;
          }
          auVar21._4_4_ = auVar98._0_4_;
          auVar21._0_4_ = auVar98._0_4_;
          auVar21._8_4_ = auVar98._8_4_;
          auVar21._12_4_ = auVar98._8_4_;
          auVar114 = auVar113 & auVar21 | auVar114;
          auVar85 = packssdw(auVar114,auVar114);
          auVar9._8_4_ = 0xffffffff;
          auVar9._0_8_ = 0xffffffffffffffff;
          auVar9._12_4_ = 0xffffffff;
          auVar85 = packssdw(auVar85 ^ auVar9,auVar85 ^ auVar9);
          auVar104 = packsswb(auVar104,auVar85);
          if ((auVar104._8_2_ >> 8 & 1) != 0) {
            puVar43[-0x24] = 0xff;
          }
          auVar104 = (auVar102 | auVar82) ^ auVar122;
          auVar100._0_4_ = -(uint)(iVar79 < auVar104._0_4_);
          auVar100._4_4_ = -(uint)(iVar71 < auVar104._4_4_);
          auVar100._8_4_ = -(uint)(iVar38 < auVar104._8_4_);
          auVar100._12_4_ = -(uint)(iVar62 < auVar104._12_4_);
          auVar115._4_4_ = auVar100._0_4_;
          auVar115._0_4_ = auVar100._0_4_;
          auVar115._8_4_ = auVar100._8_4_;
          auVar115._12_4_ = auVar100._8_4_;
          iVar66 = -(uint)(auVar104._4_4_ == iVar71);
          iVar37 = -(uint)(auVar104._12_4_ == iVar62);
          auVar22._4_4_ = iVar66;
          auVar22._0_4_ = iVar66;
          auVar22._8_4_ = iVar37;
          auVar22._12_4_ = iVar37;
          auVar121._4_4_ = auVar100._4_4_;
          auVar121._0_4_ = auVar100._4_4_;
          auVar121._8_4_ = auVar100._12_4_;
          auVar121._12_4_ = auVar100._12_4_;
          auVar104 = auVar22 & auVar115 | auVar121;
          auVar104 = packssdw(auVar104,auVar104);
          auVar10._8_4_ = 0xffffffff;
          auVar10._0_8_ = 0xffffffffffffffff;
          auVar10._12_4_ = 0xffffffff;
          auVar104 = packssdw(auVar104 ^ auVar10,auVar104 ^ auVar10);
          auVar104 = packsswb(auVar104,auVar104);
          if ((auVar104 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            puVar43[-0x28] = 0xff;
          }
          auVar104 = pshufhw(auVar104,auVar115,0x84);
          auVar23._4_4_ = iVar66;
          auVar23._0_4_ = iVar66;
          auVar23._8_4_ = iVar37;
          auVar23._12_4_ = iVar37;
          auVar106 = pshufhw(auVar100,auVar23,0x84);
          auVar85 = pshufhw(auVar104,auVar121,0x84);
          auVar90._8_4_ = 0xffffffff;
          auVar90._0_8_ = 0xffffffffffffffff;
          auVar90._12_4_ = 0xffffffff;
          auVar90 = (auVar85 | auVar106 & auVar104) ^ auVar90;
          auVar104 = packssdw(auVar90,auVar90);
          auVar104 = packsswb(auVar104,auVar104);
          if ((auVar104._10_2_ >> 8 & 1) != 0) {
            puVar43[-0x2c] = 0xff;
          }
          auVar104 = (auVar102 | _DAT_00128190) ^ auVar122;
          auVar101._0_4_ = -(uint)(iVar79 < auVar104._0_4_);
          auVar101._4_4_ = -(uint)(iVar71 < auVar104._4_4_);
          auVar101._8_4_ = -(uint)(iVar38 < auVar104._8_4_);
          auVar101._12_4_ = -(uint)(iVar62 < auVar104._12_4_);
          auVar24._4_4_ = auVar101._0_4_;
          auVar24._0_4_ = auVar101._0_4_;
          auVar24._8_4_ = auVar101._8_4_;
          auVar24._12_4_ = auVar101._8_4_;
          auVar106 = pshuflw(auVar121,auVar24,0xe8);
          auVar91._0_4_ = -(uint)(auVar104._0_4_ == iVar79);
          auVar91._4_4_ = -(uint)(auVar104._4_4_ == iVar71);
          auVar91._8_4_ = -(uint)(auVar104._8_4_ == iVar38);
          auVar91._12_4_ = -(uint)(auVar104._12_4_ == iVar62);
          auVar116._4_4_ = auVar91._4_4_;
          auVar116._0_4_ = auVar91._4_4_;
          auVar116._8_4_ = auVar91._12_4_;
          auVar116._12_4_ = auVar91._12_4_;
          auVar104 = pshuflw(auVar91,auVar116,0xe8);
          auVar117._4_4_ = auVar101._4_4_;
          auVar117._0_4_ = auVar101._4_4_;
          auVar117._8_4_ = auVar101._12_4_;
          auVar117._12_4_ = auVar101._12_4_;
          auVar85 = pshuflw(auVar101,auVar117,0xe8);
          auVar11._8_4_ = 0xffffffff;
          auVar11._0_8_ = 0xffffffffffffffff;
          auVar11._12_4_ = 0xffffffff;
          auVar104 = packssdw(auVar104 & auVar106,(auVar85 | auVar104 & auVar106) ^ auVar11);
          auVar104 = packsswb(auVar104,auVar104);
          if ((auVar104 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            puVar43[-0x30] = 0xff;
          }
          auVar25._4_4_ = auVar101._0_4_;
          auVar25._0_4_ = auVar101._0_4_;
          auVar25._8_4_ = auVar101._8_4_;
          auVar25._12_4_ = auVar101._8_4_;
          auVar117 = auVar116 & auVar25 | auVar117;
          auVar85 = packssdw(auVar117,auVar117);
          auVar12._8_4_ = 0xffffffff;
          auVar12._0_8_ = 0xffffffffffffffff;
          auVar12._12_4_ = 0xffffffff;
          auVar104 = packssdw(auVar104,auVar85 ^ auVar12);
          auVar104 = packsswb(auVar104,auVar104);
          if ((auVar104._12_2_ >> 8 & 1) != 0) {
            puVar43[-0x34] = 0xff;
          }
          auVar104 = (auVar102 | _DAT_00128180) ^ auVar122;
          auVar92._0_4_ = -(uint)(iVar79 < auVar104._0_4_);
          auVar92._4_4_ = -(uint)(iVar71 < auVar104._4_4_);
          auVar92._8_4_ = -(uint)(iVar38 < auVar104._8_4_);
          auVar92._12_4_ = -(uint)(iVar62 < auVar104._12_4_);
          auVar118._4_4_ = auVar92._0_4_;
          auVar118._0_4_ = auVar92._0_4_;
          auVar118._8_4_ = auVar92._8_4_;
          auVar118._12_4_ = auVar92._8_4_;
          auVar103._4_4_ = -(uint)(auVar104._4_4_ == iVar71);
          auVar103._12_4_ = -(uint)(auVar104._12_4_ == iVar62);
          auVar103._0_4_ = auVar103._4_4_;
          auVar103._8_4_ = auVar103._12_4_;
          auVar105._4_4_ = auVar92._4_4_;
          auVar105._0_4_ = auVar92._4_4_;
          auVar105._8_4_ = auVar92._12_4_;
          auVar105._12_4_ = auVar92._12_4_;
          auVar85 = auVar103 & auVar118 | auVar105;
          auVar104 = packssdw(auVar92,auVar85);
          auVar13._8_4_ = 0xffffffff;
          auVar13._0_8_ = 0xffffffffffffffff;
          auVar13._12_4_ = 0xffffffff;
          auVar104 = packssdw(auVar104 ^ auVar13,auVar104 ^ auVar13);
          auVar104 = packsswb(auVar104,auVar104);
          if ((auVar104 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            puVar43[-0x38] = 0xff;
          }
          auVar104 = pshufhw(auVar104,auVar118,0x84);
          in_XMM2 = pshufhw(auVar85,auVar103,0x84);
          in_XMM2 = in_XMM2 & auVar104;
          auVar104 = pshufhw(auVar104,auVar105,0x84);
          auVar93._8_4_ = 0xffffffff;
          auVar93._0_8_ = 0xffffffffffffffff;
          auVar93._12_4_ = 0xffffffff;
          auVar93 = (auVar104 | in_XMM2) ^ auVar93;
          auVar104 = packssdw(auVar93,auVar93);
          in_XMM1 = packsswb(auVar104,auVar104);
          if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
            puVar43[-0x3c] = 0xff;
          }
          uVar63 = uVar63 + 0x10;
          puVar43 = puVar43 + -0x40;
        } while ((uVar76 + 0x10 & 0x3ffffff0) != uVar63);
      }
      if ((int)local_454 < 1) {
        uVar72 = s->img_x;
      }
      else {
        uVar72 = s->img_x;
        if (0 < (int)sVar35 >> 1) {
          uVar76 = uVar72 * iVar34;
          uVar36 = (sVar35 - 1) * uVar76;
          uVar63 = 0;
          uVar78 = 0;
          do {
            if (0 < (int)uVar76) {
              uVar73 = 0;
              do {
                uVar57 = puVar64[uVar73 + uVar63];
                puVar64[uVar73 + uVar63] = puVar64[uVar73 + uVar36];
                puVar64[uVar73 + uVar36] = uVar57;
                uVar73 = uVar73 + 1;
              } while (uVar76 != uVar73);
            }
            uVar78 = uVar78 + 1;
            uVar36 = uVar36 - uVar76;
            uVar63 = (ulong)((int)uVar63 + uVar76);
          } while (uVar78 != (uint)((int)sVar35 >> 1));
        }
      }
      if ((req_comp != 0) && (iVar34 != req_comp)) {
        puVar64 = stbi__convert_format(puVar64,iVar34,req_comp,uVar72,sVar35);
        if (puVar64 == (uchar *)0x0) {
          return (void *)0x0;
        }
        uVar72 = s->img_x;
      }
      *x = uVar72;
      *y = s->img_y;
      if (comp != (int *)0x0) {
        *comp = s->img_n;
        return puVar64;
      }
      return puVar64;
    }
    psVar54 = s->img_buffer_original;
    psVar44 = s->img_buffer_original_end;
    s->img_buffer = psVar54;
    s->img_buffer_end = psVar44;
    if (uVar72 == 0x7c) goto LAB_001100f4;
  }
  else {
    if (s->read_from_callbacks != 0) {
      psVar54 = s->buffer_start;
      iVar34 = (*(s->io).read)(s->io_user_data,(char *)psVar54,s->buflen);
      if (iVar34 == 0) {
        s->read_from_callbacks = 0;
        psVar44 = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
        sVar32 = '\0';
      }
      else {
        psVar44 = psVar54 + iVar34;
        sVar32 = *psVar54;
      }
      s->img_buffer_end = psVar44;
      psVar48 = s->buffer_start + 1;
      s->img_buffer = psVar48;
      goto LAB_0010ffa5;
    }
LAB_00110183:
    psVar54 = s->img_buffer_original;
    psVar44 = s->img_buffer_original_end;
    s->img_buffer = psVar54;
    s->img_buffer_end = psVar44;
  }
  if (psVar44 <= psVar54) {
    if (s->read_from_callbacks != 0) {
      psVar54 = s->buffer_start;
      iVar34 = (*(s->io).read)(s->io_user_data,(char *)psVar54,s->buflen);
      if (iVar34 == 0) {
        s->read_from_callbacks = 0;
        psVar44 = s->buffer_start + 1;
        s->buffer_start[0] = '\0';
        sVar32 = '\0';
      }
      else {
        psVar44 = psVar54 + iVar34;
        sVar32 = *psVar54;
      }
      s->img_buffer_end = psVar44;
      psVar48 = s->buffer_start + 1;
      s->img_buffer = psVar48;
      goto LAB_00110200;
    }
LAB_00111a25:
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
LAB_00111a35:
    iVar34 = stbi__psd_test(s);
    if (iVar34 != 0) {
      pvVar45 = stbi__psd_load(s,x,y,comp,req_comp,ri,bpc);
      return pvVar45;
    }
    iVar34 = stbi__pic_test(s);
    if (iVar34 != 0) {
      pvVar45 = stbi__pic_load(s,x,y,comp,req_comp,ri_00);
      return pvVar45;
    }
    iVar34 = stbi__pnm_test(s);
    if (iVar34 != 0) {
      pvVar45 = stbi__pnm_load(s,x,y,comp,req_comp,ri_00);
      return pvVar45;
    }
    iVar34 = stbi__hdr_test(s);
    if (iVar34 == 0) {
      iVar34 = stbi__tga_test(s);
      if (iVar34 == 0) {
        stbi__g_failure_reason = "unknown image type";
        return (void *)0x0;
      }
      pvVar45 = stbi__tga_load(s,x,y,comp,req_comp,ri_00);
      return pvVar45;
    }
    data_00 = stbi__hdr_load(s,x,y,comp,req_comp,ri_00);
    if (req_comp == 0) {
      req_comp = *comp;
    }
    psVar44 = stbi__hdr_to_ldr(data_00,*x,*y,req_comp);
    return psVar44;
  }
  psVar48 = psVar54 + 1;
  s->img_buffer = psVar48;
  sVar32 = *psVar54;
LAB_00110200:
  if (sVar32 != 'G') goto LAB_00111a25;
  if (psVar48 < psVar44) {
    psVar54 = psVar48 + 1;
    s->img_buffer = psVar54;
    sVar32 = *psVar48;
  }
  else {
    if (s->read_from_callbacks == 0) goto LAB_00111a25;
    psVar54 = s->buffer_start;
    iVar34 = (*(s->io).read)(s->io_user_data,(char *)psVar54,s->buflen);
    if (iVar34 == 0) {
      s->read_from_callbacks = 0;
      psVar44 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      sVar32 = '\0';
    }
    else {
      psVar44 = psVar54 + iVar34;
      sVar32 = *psVar54;
    }
    s->img_buffer_end = psVar44;
    psVar54 = s->buffer_start + 1;
    s->img_buffer = psVar54;
  }
  if (sVar32 != 'I') goto LAB_00111a25;
  if (psVar54 < psVar44) {
    psVar48 = psVar54 + 1;
    s->img_buffer = psVar48;
    sVar32 = *psVar54;
  }
  else {
    if (s->read_from_callbacks == 0) goto LAB_00111a25;
    psVar54 = s->buffer_start;
    iVar34 = (*(s->io).read)(s->io_user_data,(char *)psVar54,s->buflen);
    if (iVar34 == 0) {
      s->read_from_callbacks = 0;
      psVar44 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      sVar32 = '\0';
    }
    else {
      psVar44 = psVar54 + iVar34;
      sVar32 = *psVar54;
    }
    s->img_buffer_end = psVar44;
    psVar48 = s->buffer_start + 1;
    s->img_buffer = psVar48;
  }
  if (sVar32 != 'F') goto LAB_00111a25;
  if (psVar48 < psVar44) {
    psVar54 = psVar48 + 1;
    s->img_buffer = psVar54;
    sVar32 = *psVar48;
  }
  else {
    if (s->read_from_callbacks == 0) goto LAB_00111a25;
    psVar54 = s->buffer_start;
    iVar34 = (*(s->io).read)(s->io_user_data,(char *)psVar54,s->buflen);
    if (iVar34 == 0) {
      s->read_from_callbacks = 0;
      psVar44 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      sVar32 = '\0';
    }
    else {
      psVar44 = psVar54 + iVar34;
      sVar32 = *psVar54;
    }
    s->img_buffer_end = psVar44;
    psVar54 = s->buffer_start + 1;
    s->img_buffer = psVar54;
  }
  if (sVar32 != '8') goto LAB_00111a25;
  if (psVar54 < psVar44) {
    psVar48 = psVar54 + 1;
    s->img_buffer = psVar48;
    sVar32 = *psVar54;
  }
  else {
    if (s->read_from_callbacks == 0) goto LAB_00111a25;
    psVar54 = s->buffer_start;
    iVar34 = (*(s->io).read)(s->io_user_data,(char *)psVar54,s->buflen);
    if (iVar34 == 0) {
      s->read_from_callbacks = 0;
      psVar44 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      sVar32 = '\0';
    }
    else {
      psVar44 = psVar54 + iVar34;
      sVar32 = *psVar54;
    }
    s->img_buffer_end = psVar44;
    psVar48 = s->buffer_start + 1;
    s->img_buffer = psVar48;
  }
  if ((sVar32 != '9') && (sVar32 != '7')) goto LAB_00111a25;
  if (psVar48 < psVar44) {
    s->img_buffer = psVar48 + 1;
    sVar32 = *psVar48;
  }
  else {
    if (s->read_from_callbacks == 0) goto LAB_00111a25;
    iVar34 = (*(s->io).read)(s->io_user_data,(char *)s->buffer_start,s->buflen);
    if (iVar34 == 0) {
      s->read_from_callbacks = 0;
      s->buffer_start[0] = '\0';
      sVar32 = '\0';
    }
    else {
      sVar32 = s->buffer_start[0];
    }
  }
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  if (sVar32 != 'a') goto LAB_00111a35;
  g = (stbi__gif *)calloc(1,0x4860);
  iVar34 = stbi__gif_header(s,g,comp,0);
  pcVar75 = stbi__g_failure_reason;
  if (iVar34 == 0) goto LAB_00112ad9;
  uVar72 = g->w;
  uVar76 = g->h;
  pcVar75 = "too large";
  if (((int)(uVar76 | uVar72) < 0) ||
     ((uVar76 != 0 &&
      (((int)(0x7fffffff / (ulong)uVar76) < (int)uVar72 || (0x1fffffff < uVar76 * uVar72))))))
  goto LAB_00112ad9;
  psVar44 = g->out;
  psVar54 = (stbi_uc *)stbi__malloc_mad3(4,uVar72,uVar76,0);
  g->out = psVar54;
  if (psVar54 == (stbi_uc *)0x0) {
    stbi__g_failure_reason = "outofmem";
    goto LAB_00112ae7;
  }
  switch((uint)g->eflags >> 2 & 7) {
  case 0:
    iVar71 = uVar72 * 4;
    iVar38 = uVar76 * iVar71;
    iVar34 = 0;
    iVar79 = 0;
    goto LAB_001125b9;
  case 1:
    if (psVar44 != (stbi_uc *)0x0) {
      memcpy(psVar54,psVar44,(long)(int)(uVar76 * uVar72 * 4));
    }
    g->old_out = psVar44;
    break;
  case 2:
    if (psVar44 != (stbi_uc *)0x0) {
      memcpy(psVar54,psVar44,(long)(int)(uVar76 * uVar72 * 4));
    }
    iVar34 = g->start_x;
    iVar79 = g->start_y;
    iVar71 = g->max_x;
    iVar38 = g->max_y;
LAB_001125b9:
    stbi__fill_gif_background(g,iVar34,iVar79,iVar71,iVar38);
    break;
  case 3:
    if (g->old_out != (stbi_uc *)0x0) {
      for (iVar34 = g->start_y; iVar34 < g->max_y; iVar34 = iVar34 + g->w * 4) {
        lVar56 = (long)g->start_x + (long)iVar34;
        memcpy(g->out + lVar56,g->old_out + lVar56,(long)g->max_x - (long)g->start_x);
      }
    }
  }
  psVar44 = s->buffer_start;
  psVar54 = s->buffer_start + 1;
LAB_00112639:
  pbVar65 = s->img_buffer;
  psVar48 = s->img_buffer_end;
  if (pbVar65 < psVar48) {
    s->img_buffer = pbVar65 + 1;
    bVar33 = *pbVar65;
    psVar49 = pbVar65 + 1;
  }
  else {
    pcVar75 = "unknown code";
    if (s->read_from_callbacks == 0) goto LAB_00112ad9;
    iVar34 = (*(s->io).read)(s->io_user_data,(char *)psVar44,s->buflen);
    if (iVar34 == 0) {
      s->read_from_callbacks = 0;
      s->buffer_start[0] = '\0';
      bVar33 = 0;
      psVar48 = psVar54;
    }
    else {
      bVar33 = *psVar44;
      psVar48 = psVar44 + iVar34;
    }
    s->img_buffer_end = psVar48;
    s->img_buffer = psVar54;
    psVar49 = psVar54;
  }
  if (bVar33 == 0x21) {
    if (psVar49 < psVar48) {
      s->img_buffer = psVar49 + 1;
      bVar33 = *psVar49;
      psVar49 = psVar49 + 1;
    }
    else {
      if (s->read_from_callbacks == 0) goto LAB_001128c8;
      iVar34 = (*(s->io).read)(s->io_user_data,(char *)psVar44,s->buflen);
      if (iVar34 == 0) {
        s->read_from_callbacks = 0;
        s->buffer_start[0] = '\0';
        bVar33 = 0;
        psVar48 = psVar54;
      }
      else {
        bVar33 = *psVar44;
        psVar48 = psVar44 + iVar34;
      }
      s->img_buffer_end = psVar48;
      s->img_buffer = psVar54;
      psVar49 = psVar54;
    }
    if (bVar33 != 0xf9) goto LAB_001128c8;
    if (psVar49 < psVar48) {
      s->img_buffer = psVar49 + 1;
      bVar33 = *psVar49;
      psVar49 = psVar49 + 1;
LAB_00112794:
      if (bVar33 == 4) {
        if (psVar49 < psVar48) {
          s->img_buffer = psVar49 + 1;
          bVar33 = *psVar49;
        }
        else if (s->read_from_callbacks == 0) {
          bVar33 = 0;
        }
        else {
          iVar34 = (*(s->io).read)(s->io_user_data,(char *)psVar44,s->buflen);
          if (iVar34 == 0) {
            s->read_from_callbacks = 0;
            s->buffer_start[0] = '\0';
            bVar33 = 0;
            psVar48 = psVar54;
          }
          else {
            bVar33 = *psVar44;
            psVar48 = psVar44 + iVar34;
          }
          s->img_buffer_end = psVar48;
          s->img_buffer = psVar54;
        }
        g->eflags = (uint)bVar33;
        iVar34 = stbi__get16le(s);
        g->delay = iVar34;
        psVar49 = s->img_buffer;
        psVar48 = s->img_buffer_end;
        if (psVar49 < psVar48) {
          s->img_buffer = psVar49 + 1;
          bVar33 = *psVar49;
          psVar49 = psVar49 + 1;
        }
        else if (s->read_from_callbacks == 0) {
          bVar33 = 0;
        }
        else {
          iVar34 = (*(s->io).read)(s->io_user_data,(char *)psVar44,s->buflen);
          if (iVar34 == 0) {
            s->read_from_callbacks = 0;
            s->buffer_start[0] = '\0';
            bVar33 = 0;
            psVar48 = psVar54;
          }
          else {
            bVar33 = *psVar44;
            psVar48 = psVar44 + iVar34;
          }
          s->img_buffer_end = psVar48;
          s->img_buffer = psVar54;
          psVar49 = psVar54;
        }
        g->transparent = (uint)bVar33;
LAB_001128c8:
        do {
          if (psVar49 < psVar48) {
            s->img_buffer = psVar49 + 1;
            bVar33 = *psVar49;
          }
          else {
            if (s->read_from_callbacks == 0) goto LAB_00112639;
            iVar34 = (*(s->io).read)(s->io_user_data,(char *)psVar44,s->buflen);
            if (iVar34 == 0) {
              s->read_from_callbacks = 0;
              s->buffer_start[0] = '\0';
              bVar33 = 0;
              psVar48 = psVar54;
            }
            else {
              bVar33 = *psVar44;
              psVar48 = psVar44 + iVar34;
            }
            s->img_buffer_end = psVar48;
            s->img_buffer = psVar54;
          }
          if (bVar33 == 0) goto LAB_00112639;
          stbi__skip(s,(uint)bVar33);
          psVar49 = s->img_buffer;
          psVar48 = s->img_buffer_end;
        } while( true );
      }
    }
    else {
      if (s->read_from_callbacks != 0) {
        iVar34 = (*(s->io).read)(s->io_user_data,(char *)psVar44,s->buflen);
        if (iVar34 == 0) {
          s->read_from_callbacks = 0;
          s->buffer_start[0] = '\0';
          bVar33 = 0;
          psVar48 = psVar54;
        }
        else {
          bVar33 = *psVar44;
          psVar48 = psVar44 + iVar34;
        }
        s->img_buffer_end = psVar48;
        s->img_buffer = psVar54;
        psVar49 = psVar54;
        goto LAB_00112794;
      }
      bVar33 = 0;
    }
    stbi__skip(s,(uint)bVar33);
    goto LAB_00112639;
  }
  pcVar75 = stbi__g_failure_reason;
  if ((bVar33 != 0x3b) && (pcVar75 = "unknown code", bVar33 == 0x2c)) {
    iVar34 = stbi__get16le(s);
    iVar79 = stbi__get16le(s);
    iVar71 = stbi__get16le(s);
    iVar38 = stbi__get16le(s);
    pcVar75 = "bad Image Descriptor";
    if ((iVar71 + iVar34 <= g->w) && (iVar38 + iVar79 <= g->h)) {
      iVar62 = g->w * 4;
      g->line_size = iVar62;
      g->start_x = iVar34 << 2;
      g->start_y = iVar79 * iVar62;
      g->max_x = (iVar71 + iVar34) * 4;
      g->max_y = (iVar38 + iVar79) * iVar62;
      g->cur_x = iVar34 << 2;
      g->cur_y = iVar79 * iVar62;
      psVar48 = s->img_buffer;
      psVar49 = s->img_buffer_end;
      if (psVar48 < psVar49) {
        s->img_buffer = psVar48 + 1;
        bVar33 = *psVar48;
        psVar48 = psVar48 + 1;
LAB_00112a88:
        g->lflags = (uint)bVar33;
        iVar34 = iVar62 * 8;
        if ((bVar33 & 0x40) == 0) {
          iVar34 = iVar62;
        }
        g->step = iVar34;
        g->parse = (int)((uint)bVar33 << 0x19) >> 0x1f & 3;
        if (-1 < (char)bVar33) goto LAB_00112ac4;
        pal = g->lpal;
        local_528._0_4_ = 0xffffffff;
        iVar34 = -1;
        if ((g->eflags & 1) != 0) {
          iVar34 = g->transparent;
        }
        stbi__gif_parse_colortable(s,pal,2 << (bVar33 & 7),iVar34);
        psVar48 = s->img_buffer;
        psVar49 = s->img_buffer_end;
      }
      else {
        if (s->read_from_callbacks != 0) {
          iVar34 = (*(s->io).read)(s->io_user_data,(char *)psVar44,s->buflen);
          if (iVar34 == 0) {
            s->read_from_callbacks = 0;
            s->buffer_start[0] = '\0';
            bVar33 = 0;
            psVar49 = psVar54;
          }
          else {
            bVar33 = *psVar44;
            psVar49 = psVar44 + iVar34;
          }
          s->img_buffer_end = psVar49;
          s->img_buffer = psVar54;
          iVar62 = g->line_size;
          psVar48 = psVar54;
          goto LAB_00112a88;
        }
        g->lflags = 0;
        g->step = iVar62;
        g->parse = 0;
LAB_00112ac4:
        if ((g->flags & 0x80) == 0) {
          pcVar75 = "missing color table";
          goto LAB_00112ad9;
        }
        lVar56 = (long)g->transparent;
        local_528._0_4_ = 0xffffffff;
        if ((-1 < lVar56) && ((g->eflags & 1) != 0)) {
          local_528._0_4_ = (uint)g->pal[lVar56][3];
          g->pal[lVar56][3] = '\0';
        }
        pal = g->pal;
      }
      g->color_table = *pal;
      if (psVar48 < psVar49) {
        s->img_buffer = psVar48 + 1;
        bVar33 = *psVar48;
      }
      else {
        if (s->read_from_callbacks == 0) {
          bVar33 = 0;
          goto LAB_00112bf5;
        }
        iVar34 = (*(s->io).read)(s->io_user_data,(char *)psVar44,s->buflen);
        if (iVar34 == 0) {
          s->read_from_callbacks = 0;
          s->buffer_start[0] = '\0';
          bVar33 = 0;
          psVar48 = psVar54;
        }
        else {
          bVar33 = *psVar44;
          psVar48 = psVar44 + iVar34;
        }
        s->img_buffer_end = psVar48;
        s->img_buffer = psVar54;
      }
      pcVar75 = stbi__g_failure_reason;
      if (bVar33 < 0xd) {
LAB_00112bf5:
        uVar72 = 1 << (bVar33 & 0x1f);
        uVar63 = 0;
        do {
          g->codes[uVar63].prefix = -1;
          g->codes[uVar63].first = (stbi_uc)uVar63;
          g->codes[uVar63].suffix = (stbi_uc)uVar63;
          uVar63 = uVar63 + 1;
        } while (uVar72 != uVar63);
        uVar39 = (2 << (bVar33 & 0x1f)) - 1;
        uVar52 = 0;
        iVar34 = 0;
        uVar76 = 0;
        bVar58 = 0;
        uVar36 = uVar72 + 2;
        uVar59 = 0xffffffff;
        iVar79 = bVar33 + 1;
        uVar28 = uVar39;
LAB_00112c9e:
        do {
          for (; uVar40 = uVar28, iVar71 = iVar79, uVar60 = uVar59, uVar53 = uVar36, bVar26 = bVar58
              , iVar79 = iVar34 - iVar71, iVar34 < iVar71; iVar34 = iVar34 + 8) {
            psVar48 = s->img_buffer;
            psVar49 = s->img_buffer_end;
            if (uVar52 == 0) {
              if (psVar48 < psVar49) {
                s->img_buffer = psVar48 + 1;
                bVar58 = *psVar48;
                psVar48 = psVar48 + 1;
              }
              else {
                if (s->read_from_callbacks == 0) goto LAB_00112f7b;
                iVar79 = (*(s->io).read)(s->io_user_data,(char *)psVar44,s->buflen);
                if (iVar79 == 0) {
                  s->read_from_callbacks = 0;
                  s->buffer_start[0] = '\0';
                  bVar58 = 0;
                  psVar49 = psVar54;
                }
                else {
                  bVar58 = *psVar44;
                  psVar49 = psVar44 + iVar79;
                }
                s->img_buffer_end = psVar49;
                s->img_buffer = psVar54;
                psVar48 = psVar54;
              }
              if (bVar58 == 0) goto LAB_00112f7b;
              uVar52 = (uint)bVar58;
            }
            if (psVar48 < psVar49) {
              s->img_buffer = psVar48 + 1;
              bVar58 = *psVar48;
            }
            else if (s->read_from_callbacks == 0) {
              bVar58 = 0;
            }
            else {
              iVar79 = (*(s->io).read)(s->io_user_data,(char *)psVar44,s->buflen);
              if (iVar79 == 0) {
                s->read_from_callbacks = 0;
                s->buffer_start[0] = '\0';
                bVar58 = 0;
                psVar48 = psVar54;
              }
              else {
                bVar58 = *psVar44;
                psVar48 = psVar44 + iVar79;
              }
              s->img_buffer_end = psVar48;
              s->img_buffer = psVar54;
            }
            bVar51 = (byte)iVar34;
            uVar52 = uVar52 - 1;
            uVar76 = uVar76 | (uint)bVar58 << (bVar51 & 0x1f);
            bVar58 = bVar26;
            uVar36 = uVar53;
            uVar59 = uVar60;
            iVar79 = iVar71;
            uVar28 = uVar40;
          }
          uVar36 = (int)uVar76 >> ((byte)iVar71 & 0x1f);
          uVar70 = uVar76 & uVar40;
          iVar34 = iVar79;
          uVar76 = uVar36;
          bVar58 = 1;
          uVar36 = uVar72 + 2;
          uVar59 = 0xffffffff;
          iVar79 = bVar33 + 1;
          uVar28 = uVar39;
        } while (uVar70 == uVar72);
        if (uVar70 == uVar72 + 1) goto LAB_00112eee;
        if ((int)uVar53 < (int)uVar70) {
          pcVar75 = "illegal code in raster";
          goto LAB_00112ad9;
        }
        pcVar75 = "no clear code";
        if ((bool)(bVar26 ^ 1)) goto LAB_00112ad9;
        if ((int)uVar60 < 0) {
          if (uVar70 == uVar53) goto LAB_00112ffa;
        }
        else {
          if (0xfff < (int)uVar53) {
            pcVar75 = "too many codes";
            goto LAB_00112ad9;
          }
          g->codes[(int)uVar53].prefix = (stbi__int16)uVar60;
          sVar32 = g->codes[uVar60].first;
          g->codes[(int)uVar53].first = sVar32;
          if (uVar70 != uVar53 + 1) {
            sVar32 = g->codes[(int)uVar70].first;
          }
          g->codes[(int)uVar53].suffix = sVar32;
          uVar53 = uVar53 + 1;
        }
        stbi__out_gif_code(g,(stbi__uint16)uVar70);
        bVar58 = 1;
        uVar36 = uVar53;
        uVar59 = uVar70;
        iVar79 = iVar71 + 1;
        uVar28 = ~(-1 << ((byte)(iVar71 + 1) & 0x1f));
        if (0xfff < (int)uVar53 || (uVar53 & uVar40) != 0) {
          iVar79 = iVar71;
          uVar28 = uVar40;
        }
        goto LAB_00112c9e;
      }
    }
  }
LAB_00112ad9:
  stbi__g_failure_reason = pcVar75;
  if (g->out != (stbi_uc *)0x0) {
    free(g->out);
  }
LAB_00112ae7:
  psVar50 = (stbi__context *)0x0;
LAB_00112ae9:
  free(g);
  return psVar50;
LAB_0010fd62:
  bVar80 = false;
LAB_0010fd64:
  if (!bVar80) goto LAB_00110653;
LAB_0010fd71:
  bVar33 = psVar41->marker;
LAB_0010fd7c:
  if (bVar33 == 0xff) {
LAB_0010fd84:
    do {
      psVar50 = psVar41->s;
      if ((psVar50->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0010fda8:
        if (psVar50->img_buffer_end <= psVar50->img_buffer) goto LAB_0010eab8;
      }
      else {
        iVar34 = (*(psVar50->io).eof)(psVar50->io_user_data);
        if (iVar34 != 0) {
          if (psVar50->read_from_callbacks != 0) goto LAB_0010fda8;
          goto LAB_0010eab8;
        }
      }
      psVar50 = psVar41->s;
      psVar44 = psVar50->img_buffer;
      if (psVar44 < psVar50->img_buffer_end) {
        psVar50->img_buffer = psVar44 + 1;
        sVar32 = *psVar44;
      }
      else {
        if (psVar50->read_from_callbacks == 0) goto LAB_0010fd84;
        psVar44 = psVar50->buffer_start;
        iVar34 = (*(psVar50->io).read)(psVar50->io_user_data,(char *)psVar44,psVar50->buflen);
        if (iVar34 == 0) {
          psVar50->read_from_callbacks = 0;
          psVar54 = psVar50->buffer_start + 1;
          psVar50->buffer_start[0] = '\0';
          sVar32 = '\0';
        }
        else {
          psVar54 = psVar44 + iVar34;
          sVar32 = *psVar44;
        }
        psVar50->img_buffer_end = psVar54;
        psVar50->img_buffer = psVar50->buffer_start + 1;
      }
    } while (sVar32 != 0xff);
    psVar50 = psVar41->s;
    psVar44 = psVar50->img_buffer;
    if (psVar44 < psVar50->img_buffer_end) {
      psVar50->img_buffer = psVar44 + 1;
      sVar32 = *psVar44;
    }
    else if (psVar50->read_from_callbacks == 0) {
      sVar32 = '\0';
    }
    else {
      psVar44 = psVar50->buffer_start;
      iVar34 = (*(psVar50->io).read)(psVar50->io_user_data,(char *)psVar44,psVar50->buflen);
      if (iVar34 == 0) {
        psVar50->read_from_callbacks = 0;
        psVar54 = psVar50->buffer_start + 1;
        psVar50->buffer_start[0] = '\0';
        sVar32 = '\0';
      }
      else {
        psVar54 = psVar44 + iVar34;
        sVar32 = *psVar44;
      }
      psVar50->img_buffer_end = psVar54;
      psVar50->img_buffer = psVar50->buffer_start + 1;
    }
    psVar41->marker = sVar32;
  }
LAB_0010eab8:
  bVar33 = stbi__get_marker(psVar41);
  goto LAB_0010ea51;
LAB_00112559:
  paVar61 = (anon_struct_96_18_0d0905d3 *)(ulong)(uVar76 - 0x10);
  psVar41->code_bits = uVar76 - 0x10;
LAB_00112562:
  stbi__g_failure_reason = "bad huffman code";
LAB_0011064c:
  uVar72 = (uint)paVar61;
  goto LAB_00110653;
LAB_00112eee:
  stbi__skip(s,uVar52);
  pbVar65 = s->img_buffer;
  if (pbVar65 < s->img_buffer_end) {
    s->img_buffer = pbVar65 + 1;
    bVar33 = *pbVar65;
  }
  else {
    if (s->read_from_callbacks == 0) goto LAB_00112f7b;
    iVar34 = (*(s->io).read)(s->io_user_data,(char *)psVar44,s->buflen);
    if (iVar34 == 0) {
      s->read_from_callbacks = 0;
      s->buffer_start[0] = '\0';
      bVar33 = 0;
      psVar48 = psVar54;
    }
    else {
      bVar33 = *psVar44;
      psVar48 = psVar44 + iVar34;
    }
    s->img_buffer_end = psVar48;
    s->img_buffer = psVar54;
  }
  if (bVar33 == 0) goto LAB_00112f7b;
  uVar52 = (uint)bVar33;
  goto LAB_00112eee;
LAB_00112f7b:
  psVar50 = (stbi__context *)g->out;
  if (psVar50 != (stbi__context *)0x0) {
    if ((uint)local_528 != 0xffffffff) {
      g->pal[g->transparent][3] = (stbi_uc)(uint)local_528;
    }
    pcVar75 = stbi__g_failure_reason;
    if (psVar50 != s) {
      uVar72 = g->w;
      *x = uVar72;
      uVar76 = g->h;
      *y = uVar76;
      if ((req_comp & 0xfffffffbU) != 0) {
        psVar50 = (stbi__context *)stbi__convert_format((uchar *)psVar50,4,req_comp,uVar72,uVar76);
      }
      goto LAB_00112ae9;
    }
    goto LAB_00112ad9;
  }
  goto LAB_00112ae7;
LAB_00112ffa:
  pcVar75 = "illegal code in raster";
  goto LAB_00112ad9;
}

Assistant:

static void *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   memset(ri, 0, sizeof(*ri)); // make sure it's initialized if we add new fields
   ri->bits_per_channel = 8; // default is 8 so most paths don't have to be changed
   ri->channel_order = STBI_ORDER_RGB; // all current input & output are this, but this is here so we can add BGR order
   ri->num_channels = 0;

   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp, ri, bpc);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp, ri);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp, ri);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp, ri);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}